

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined4 uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar24;
  unsigned_long uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  uint uVar30;
  float fVar70;
  float fVar72;
  undefined1 auVar31 [16];
  uint uVar71;
  uint uVar73;
  float fVar74;
  uint uVar75;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar69;
  float fVar76;
  uint uVar77;
  float fVar94;
  float fVar96;
  float fVar97;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar95;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar112;
  float fVar113;
  Vec3ff v3;
  undefined1 auVar99 [16];
  float fVar114;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar115;
  float fVar116;
  float fVar124;
  float fVar126;
  Vec3fa n1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar123;
  float fVar128;
  float fVar135;
  float fVar136;
  Vec3fa n0;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar138;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  vfloat4 a;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar170;
  float fVar173;
  float fVar177;
  float fVar180;
  uint uVar183;
  vfloat4 a_1;
  float fVar171;
  float fVar172;
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar184;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  uint uVar185;
  float fVar186;
  uint uVar187;
  float fVar189;
  float fVar190;
  uint uVar191;
  float fVar192;
  undefined1 auVar188 [16];
  uint uVar193;
  uint uVar194;
  uint uVar200;
  uint uVar201;
  uint uVar202;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  uint uVar207;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  uint uVar208;
  uint uVar214;
  uint uVar215;
  uint uVar216;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar223;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar234;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 local_2b8 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  size_t local_b8;
  size_t local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
  *pCVar23;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar25 = r->_begin;
  local_b8 = 0;
  local_78 = _DAT_01f45a40;
  local_88 = _DAT_01f45a30;
  local_98 = _DAT_01f45a40;
  local_a8 = _DAT_01f45a30;
  local_b0 = k;
  while( true ) {
    if (r->_end <= uVar25) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_98._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_98._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_88._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_88._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_78._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_78._8_8_;
      __return_storage_ptr__->end = local_b8;
      return __return_storage_ptr__;
    }
    pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar22 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.field_0x68 * uVar25);
    uVar21 = (ulong)uVar22;
    uVar26 = (ulong)(uVar22 + 3);
    if (uVar26 < (pBVar6->super_RawBufferView).num) break;
LAB_001fcab2:
    uVar25 = uVar25 + 1;
  }
  uVar27 = (ulong)(uVar22 + 1);
  uVar28 = (ulong)(uVar22 + 2);
  pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.normals.
           items;
  fVar173 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
            maxRadiusScale;
  lVar24 = 0;
  pCVar23 = this;
LAB_001fbb2c:
  if (lVar24 == (ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                        super_CurveGeometry.super_Geometry.numTimeSteps - 1) + 1) {
    pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
    sVar9 = (pBVar6->super_RawBufferView).stride;
    pfVar1 = (float *)(pcVar8 + sVar9 * uVar21);
    fVar29 = *pfVar1;
    fVar70 = pfVar1[1];
    fVar72 = pfVar1[2];
    pfVar2 = (float *)(pcVar8 + sVar9 * uVar27);
    pfVar3 = (float *)(pcVar8 + sVar9 * uVar28);
    pfVar4 = (float *)(pcVar8 + sVar9 * uVar26);
    fVar74 = *pfVar4;
    fVar76 = pfVar4[1];
    fVar94 = pfVar4[2];
    fVar173 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
              maxRadiusScale;
    fVar154 = pfVar1[3] * fVar173;
    fVar177 = pfVar4[3] * fVar173;
    pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.normals.
             items;
    pcVar8 = (pBVar7->super_RawBufferView).ptr_ofs;
    sVar9 = (pBVar7->super_RawBufferView).stride;
    pfVar1 = (float *)(pcVar8 + uVar21 * sVar9);
    fVar96 = *pfVar1;
    fVar97 = pfVar1[1];
    fVar137 = pfVar1[2];
    pfVar1 = (float *)(pcVar8 + uVar27 * sVar9);
    pfVar4 = (float *)(pcVar8 + uVar28 * sVar9);
    pfVar5 = (float *)(pcVar8 + sVar9 * uVar26);
    fVar150 = *pfVar5;
    fVar152 = pfVar5[1];
    fVar156 = pfVar5[2];
    fVar115 = *pfVar3 * 0.0;
    fVar230 = pfVar3[1] * 0.0;
    fVar190 = pfVar3[2] * 0.0;
    fVar192 = pfVar3[3] * fVar173 * 0.0;
    fVar98 = fVar74 * 0.0 + fVar115;
    fVar112 = fVar76 * 0.0 + fVar230;
    fVar113 = fVar94 * 0.0 + fVar190;
    fVar114 = fVar177 * 0.0 + fVar192;
    fVar124 = *pfVar2 * 0.0;
    fVar179 = pfVar2[1] * 0.0;
    fVar182 = pfVar2[2] * 0.0;
    fVar189 = pfVar2[3] * fVar173 * 0.0;
    fVar155 = fVar124 + fVar98 + fVar29;
    fVar165 = fVar179 + fVar112 + fVar70;
    fVar170 = fVar182 + fVar113 + fVar72;
    fVar232 = fVar189 + fVar114 + fVar154;
    fVar98 = (*pfVar2 * 3.0 + fVar98) - fVar29 * 3.0;
    fVar112 = (pfVar2[1] * 3.0 + fVar112) - fVar70 * 3.0;
    fVar113 = (pfVar2[2] * 3.0 + fVar113) - fVar72 * 3.0;
    fVar114 = (pfVar2[3] * fVar173 * 3.0 + fVar114) - fVar154 * 3.0;
    fVar153 = *pfVar4 * 0.0;
    fVar171 = pfVar4[1] * 0.0;
    fVar172 = pfVar4[2] * 0.0;
    fVar128 = fVar150 * 0.0 + fVar153;
    fVar135 = fVar152 * 0.0 + fVar171;
    fVar136 = fVar156 * 0.0 + fVar172;
    fVar178 = *pfVar1 * 0.0;
    fVar181 = pfVar1[1] * 0.0;
    fVar186 = pfVar1[2] * 0.0;
    fVar242 = fVar178 + fVar128 + fVar96;
    fVar184 = fVar181 + fVar135 + fVar97;
    fVar151 = fVar186 + fVar136 + fVar137;
    fVar234 = (*pfVar1 * 3.0 + fVar128) - fVar96 * 3.0;
    fVar241 = (pfVar1[1] * 3.0 + fVar135) - fVar97 * 3.0;
    fVar180 = (pfVar1[2] * 3.0 + fVar136) - fVar137 * 3.0;
    fVar135 = fVar115 + fVar74 + fVar124 + fVar29 * 0.0;
    fVar115 = fVar230 + fVar76 + fVar179 + fVar70 * 0.0;
    fVar230 = fVar190 + fVar94 + fVar182 + fVar72 * 0.0;
    fVar190 = fVar192 + fVar177 + fVar189 + fVar154 * 0.0;
    fVar128 = ((fVar74 * 3.0 - *pfVar3 * 3.0) + fVar124) - fVar29 * 0.0;
    fVar136 = ((fVar76 * 3.0 - pfVar3[1] * 3.0) + fVar179) - fVar70 * 0.0;
    fVar124 = ((fVar94 * 3.0 - pfVar3[2] * 3.0) + fVar182) - fVar72 * 0.0;
    fVar154 = ((fVar177 * 3.0 - pfVar3[3] * fVar173 * 3.0) + fVar189) - fVar154 * 0.0;
    fVar173 = fVar153 + fVar150 + fVar178 + fVar96 * 0.0;
    fVar76 = fVar171 + fVar152 + fVar181 + fVar97 * 0.0;
    fVar177 = fVar172 + fVar156 + fVar186 + fVar137 * 0.0;
    fVar29 = ((fVar150 * 3.0 - *pfVar4 * 3.0) + fVar178) - fVar96 * 0.0;
    fVar70 = ((fVar152 * 3.0 - pfVar4[1] * 3.0) + fVar181) - fVar97 * 0.0;
    fVar72 = ((fVar156 * 3.0 - pfVar4[2] * 3.0) + fVar186) - fVar137 * 0.0;
    fVar153 = fVar112 * fVar242 - fVar184 * fVar98;
    fVar171 = fVar113 * fVar184 - fVar151 * fVar112;
    fVar172 = fVar98 * fVar151 - fVar242 * fVar113;
    fVar74 = fVar112 * fVar234 - fVar241 * fVar98;
    fVar94 = fVar113 * fVar241 - fVar180 * fVar112;
    fVar234 = fVar98 * fVar180 - fVar234 * fVar113;
    fVar97 = fVar136 * fVar173 - fVar76 * fVar128;
    fVar96 = fVar124 * fVar76 - fVar177 * fVar136;
    fVar156 = fVar128 * fVar177 - fVar173 * fVar124;
    fVar173 = fVar136 * fVar29 - fVar70 * fVar128;
    fVar70 = fVar124 * fVar70 - fVar72 * fVar136;
    fVar72 = fVar128 * fVar72 - fVar29 * fVar124;
    fVar242 = fVar172 * fVar172 + fVar171 * fVar171 + fVar153 * fVar153;
    auVar188 = ZEXT416((uint)fVar242);
    auVar158 = rsqrtss(ZEXT416((uint)fVar242),auVar188);
    fVar29 = auVar158._0_4_;
    fVar184 = fVar29 * 1.5 - fVar29 * fVar29 * fVar242 * 0.5 * fVar29;
    fVar178 = fVar153 * fVar74 + fVar172 * fVar234 + fVar171 * fVar94;
    auVar158 = rcpss(auVar188,auVar188);
    fVar76 = (2.0 - fVar242 * auVar158._0_4_) * auVar158._0_4_;
    fVar241 = fVar156 * fVar156 + fVar96 * fVar96 + fVar97 * fVar97;
    auVar158 = ZEXT416((uint)fVar241);
    auVar188 = rsqrtss(ZEXT416((uint)fVar241),auVar158);
    fVar29 = auVar188._0_4_;
    fVar137 = fVar29 * 1.5 - fVar29 * fVar29 * fVar241 * 0.5 * fVar29;
    fVar151 = fVar97 * fVar173 + fVar156 * fVar72 + fVar96 * fVar70;
    auVar158 = rcpss(auVar158,auVar158);
    fVar29 = (2.0 - fVar241 * auVar158._0_4_) * auVar158._0_4_;
    fVar150 = fVar232 * fVar171 * fVar184;
    fVar152 = fVar232 * fVar172 * fVar184;
    fVar177 = fVar232 * fVar153 * fVar184;
    fVar179 = fVar155 - fVar150;
    fVar181 = fVar165 - fVar152;
    fVar182 = fVar170 - fVar177;
    fVar180 = fVar232 * fVar76 * (fVar242 * fVar94 - fVar178 * fVar171) * fVar184 +
              fVar114 * fVar171 * fVar184;
    fVar234 = fVar232 * fVar76 * (fVar242 * fVar234 - fVar178 * fVar172) * fVar184 +
              fVar114 * fVar172 * fVar184;
    fVar242 = fVar232 * fVar76 * (fVar242 * fVar74 - fVar178 * fVar153) * fVar184 +
              fVar114 * fVar153 * fVar184;
    fVar74 = fVar190 * fVar96 * fVar137;
    fVar76 = fVar190 * fVar156 * fVar137;
    fVar94 = fVar190 * fVar97 * fVar137;
    fVar184 = fVar135 - fVar74;
    fVar153 = fVar115 - fVar76;
    fVar171 = fVar230 - fVar94;
    fVar96 = fVar190 * fVar29 * (fVar241 * fVar70 - fVar151 * fVar96) * fVar137 +
             fVar154 * fVar96 * fVar137;
    fVar72 = fVar190 * fVar29 * (fVar241 * fVar72 - fVar151 * fVar156) * fVar137 +
             fVar154 * fVar156 * fVar137;
    fVar97 = fVar190 * fVar29 * (fVar241 * fVar173 - fVar151 * fVar97) * fVar137 +
             fVar154 * fVar97 * fVar137;
    fVar137 = (fVar98 - fVar180) * 0.33333334 + fVar179;
    fVar156 = (fVar112 - fVar234) * 0.33333334 + fVar181;
    fVar114 = (fVar113 - fVar242) * 0.33333334 + fVar182;
    fVar173 = fVar184 - (fVar128 - fVar96) * 0.33333334;
    fVar29 = fVar153 - (fVar136 - fVar72) * 0.33333334;
    fVar70 = fVar171 - (fVar124 - fVar97) * 0.33333334;
    uVar21 = 0;
    local_278 = _DAT_01f45a40;
    local_268 = _DAT_01f45a40;
    local_2b8._8_8_ = 0x7f8000007f800000;
    local_2b8._0_8_ = 0x7f8000007f800000;
    local_258._8_8_ = 0x7f8000007f800000;
    local_258._0_8_ = 0x7f8000007f800000;
    local_248._8_8_ = 0x7f8000007f800000;
    local_248._0_8_ = 0x7f8000007f800000;
    auVar158 = _DAT_01f45a40;
    while( true ) {
      uVar187 = local_278._0_4_;
      uVar191 = local_278._8_4_;
      uVar193 = local_278._12_4_;
      uVar22 = local_268._0_4_;
      uVar183 = local_268._8_4_;
      uVar185 = local_268._12_4_;
      if (7 < uVar21) break;
      uVar207 = (uint)uVar21;
      uVar77 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar216 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar71 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar75 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      lVar24 = uVar21 * 4;
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x1dc);
      fVar241 = *(float *)(bezier_basis0 + lVar24 + 0x1e0);
      fVar151 = *(float *)(bezier_basis0 + lVar24 + 0x1e4);
      fVar172 = *(float *)(bezier_basis0 + lVar24 + 0x1e8);
      lVar24 = uVar21 * 4;
      fVar178 = *(float *)(bezier_basis0 + lVar24 + 0x660);
      fVar186 = *(float *)(bezier_basis0 + lVar24 + 0x664);
      fVar189 = *(float *)(bezier_basis0 + lVar24 + 0x668);
      fVar190 = *(float *)(bezier_basis0 + lVar24 + 0x66c);
      lVar24 = uVar21 * 4;
      fVar192 = *(float *)(bezier_basis0 + lVar24 + 0xae4);
      fVar232 = *(float *)(bezier_basis0 + lVar24 + 0xae8);
      fVar243 = *(float *)(bezier_basis0 + lVar24 + 0xaec);
      fVar10 = *(float *)(bezier_basis0 + lVar24 + 0xaf0);
      lVar24 = uVar21 * 4;
      fVar11 = *(float *)(bezier_basis0 + lVar24 + 0xf68);
      fVar12 = *(float *)(bezier_basis0 + lVar24 + 0xf6c);
      fVar13 = *(float *)(bezier_basis0 + lVar24 + 0xf70);
      fVar14 = *(float *)(bezier_basis0 + lVar24 + 0xf74);
      auVar199._0_4_ = fVar179 * fVar154 + fVar137 * fVar178 + fVar173 * fVar192 + fVar184 * fVar11;
      auVar199._4_4_ = fVar179 * fVar241 + fVar137 * fVar186 + fVar173 * fVar232 + fVar184 * fVar12;
      auVar199._8_4_ = fVar179 * fVar151 + fVar137 * fVar189 + fVar173 * fVar243 + fVar184 * fVar13;
      auVar199._12_4_ = fVar179 * fVar172 + fVar137 * fVar190 + fVar173 * fVar10 + fVar184 * fVar14;
      auVar205._0_4_ = fVar181 * fVar154 + fVar156 * fVar178 + fVar29 * fVar192 + fVar153 * fVar11;
      auVar205._4_4_ = fVar181 * fVar241 + fVar156 * fVar186 + fVar29 * fVar232 + fVar153 * fVar12;
      auVar205._8_4_ = fVar181 * fVar151 + fVar156 * fVar189 + fVar29 * fVar243 + fVar153 * fVar13;
      auVar205._12_4_ = fVar181 * fVar172 + fVar156 * fVar190 + fVar29 * fVar10 + fVar153 * fVar14;
      local_f8._0_4_ = fVar154 * fVar182 + fVar178 * fVar114 + fVar192 * fVar70 + fVar11 * fVar171;
      local_f8._4_4_ = fVar241 * fVar182 + fVar186 * fVar114 + fVar232 * fVar70 + fVar12 * fVar171;
      fStack_f0 = fVar151 * fVar182 + fVar189 * fVar114 + fVar243 * fVar70 + fVar13 * fVar171;
      fStack_ec = fVar172 * fVar182 + fVar190 * fVar114 + fVar10 * fVar70 + fVar14 * fVar171;
      lVar24 = uVar21 * 4;
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x13ec);
      fVar241 = *(float *)(bezier_basis0 + lVar24 + 0x13f0);
      fVar151 = *(float *)(bezier_basis0 + lVar24 + 0x13f4);
      fVar172 = *(float *)(bezier_basis0 + lVar24 + 0x13f8);
      lVar24 = uVar21 * 4;
      fVar178 = *(float *)(bezier_basis0 + lVar24 + 0x1870);
      fVar186 = *(float *)(bezier_basis0 + lVar24 + 0x1874);
      fVar189 = *(float *)(bezier_basis0 + lVar24 + 0x1878);
      fVar190 = *(float *)(bezier_basis0 + lVar24 + 0x187c);
      lVar24 = uVar21 * 4;
      fVar192 = *(float *)(bezier_basis0 + lVar24 + 0x1cf4);
      fVar232 = *(float *)(bezier_basis0 + lVar24 + 0x1cf8);
      fVar243 = *(float *)(bezier_basis0 + lVar24 + 0x1cfc);
      fVar10 = *(float *)(bezier_basis0 + lVar24 + 0x1d00);
      lVar24 = uVar21 * 4;
      fVar11 = *(float *)(bezier_basis0 + lVar24 + 0x2178);
      fVar12 = *(float *)(bezier_basis0 + lVar24 + 0x217c);
      fVar13 = *(float *)(bezier_basis0 + lVar24 + 0x2180);
      fVar14 = *(float *)(bezier_basis0 + lVar24 + 0x2184);
      fVar138 = fVar179 * fVar154 + fVar137 * fVar178 + fVar173 * fVar192 + fVar184 * fVar11;
      fVar116 = fVar179 * fVar241 + fVar137 * fVar186 + fVar173 * fVar232 + fVar184 * fVar12;
      fVar125 = fVar179 * fVar151 + fVar137 * fVar189 + fVar173 * fVar243 + fVar184 * fVar13;
      fVar126 = fVar179 * fVar172 + fVar137 * fVar190 + fVar173 * fVar10 + fVar184 * fVar14;
      fVar127 = fVar181 * fVar154 + fVar156 * fVar178 + fVar29 * fVar192 + fVar153 * fVar11;
      fVar223 = fVar181 * fVar241 + fVar156 * fVar186 + fVar29 * fVar232 + fVar153 * fVar12;
      fVar229 = fVar181 * fVar151 + fVar156 * fVar189 + fVar29 * fVar243 + fVar153 * fVar13;
      fVar231 = fVar181 * fVar172 + fVar156 * fVar190 + fVar29 * fVar10 + fVar153 * fVar14;
      fVar154 = fVar154 * fVar182 + fVar178 * fVar114 + fVar192 * fVar70 + fVar11 * fVar171;
      fVar241 = fVar241 * fVar182 + fVar186 * fVar114 + fVar232 * fVar70 + fVar12 * fVar171;
      fVar151 = fVar151 * fVar182 + fVar189 * fVar114 + fVar243 * fVar70 + fVar13 * fVar171;
      fVar172 = fVar172 * fVar182 + fVar190 * fVar114 + fVar10 * fVar70 + fVar14 * fVar171;
      uVar194 = -(uint)(uVar207 == 0);
      uVar200 = -(uint)(uVar207 == 1);
      uVar201 = -(uint)(uVar207 == 2);
      uVar202 = -(uint)(uVar207 == 3);
      uVar95 = -(uint)(uVar207 == 7);
      uVar30 = -(uint)(uVar207 == 6);
      uVar73 = -(uint)(uVar207 == 5);
      uVar207 = -(uint)(uVar207 == 4);
      local_228._4_4_ = (float)(~uVar30 & (uint)fVar116) * 0.055555556 + auVar199._4_4_;
      local_228._0_4_ = (float)(~uVar95 & (uint)fVar138) * 0.055555556 + auVar199._0_4_;
      fStack_220 = (float)(~uVar73 & (uint)fVar125) * 0.055555556 + auVar199._8_4_;
      fStack_21c = (float)(~uVar207 & (uint)fVar126) * 0.055555556 + auVar199._12_4_;
      auVar188 = minps(local_2b8,auVar199);
      auVar146 = maxps(local_278,auVar199);
      auVar168._0_8_ =
           CONCAT44(auVar199._4_4_ - (float)(~uVar200 & (uint)fVar116) * 0.055555556,
                    auVar199._0_4_ - (float)(~uVar194 & (uint)fVar138) * 0.055555556);
      auVar168._8_4_ = auVar199._8_4_ - (float)(~uVar201 & (uint)fVar125) * 0.055555556;
      auVar168._12_4_ = auVar199._12_4_ - (float)(~uVar202 & (uint)fVar126) * 0.055555556;
      auVar147._0_4_ = (float)(~uVar95 & (uint)fVar127) * 0.055555556 + auVar205._0_4_;
      auVar147._4_4_ = (float)(~uVar30 & (uint)fVar223) * 0.055555556 + auVar205._4_4_;
      auVar147._8_4_ = (float)(~uVar73 & (uint)fVar229) * 0.055555556 + auVar205._8_4_;
      auVar147._12_4_ = (float)(~uVar207 & (uint)fVar231) * 0.055555556 + auVar205._12_4_;
      auVar235 = minps(local_258,auVar205);
      auVar220 = maxps(local_268,auVar205);
      auVar211._0_8_ =
           CONCAT44(auVar205._4_4_ - (float)(~uVar200 & (uint)fVar223) * 0.055555556,
                    auVar205._0_4_ - (float)(~uVar194 & (uint)fVar127) * 0.055555556);
      auVar211._8_4_ = auVar205._8_4_ - (float)(~uVar201 & (uint)fVar229) * 0.055555556;
      auVar211._12_4_ = auVar205._12_4_ - (float)(~uVar202 & (uint)fVar231) * 0.055555556;
      auVar196._0_4_ = (float)(~uVar95 & (uint)fVar154) * 0.055555556 + (float)local_f8._0_4_;
      auVar196._4_4_ = (float)(~uVar30 & (uint)fVar241) * 0.055555556 + (float)local_f8._4_4_;
      auVar196._8_4_ = (float)(~uVar73 & (uint)fVar151) * 0.055555556 + fStack_f0;
      auVar196._12_4_ = (float)(~uVar207 & (uint)fVar172) * 0.055555556 + fStack_ec;
      auVar199 = minps(local_248,_local_f8);
      auVar205 = maxps(auVar158,_local_f8);
      auVar167._0_8_ =
           CONCAT44((float)local_f8._4_4_ - (float)(~uVar200 & (uint)fVar241) * 0.055555556,
                    (float)local_f8._0_4_ - (float)(~uVar194 & (uint)fVar154) * 0.055555556);
      auVar167._8_4_ = fStack_f0 - (float)(~uVar201 & (uint)fVar151) * 0.055555556;
      auVar167._12_4_ = fStack_ec - (float)(~uVar202 & (uint)fVar172) * 0.055555556;
      auVar203._8_4_ = auVar168._8_4_;
      auVar203._0_8_ = auVar168._0_8_;
      auVar203._12_4_ = auVar168._12_4_;
      auVar174 = minps(auVar203,_local_228);
      auVar188 = minps(auVar188,auVar174);
      auVar217._8_4_ = auVar211._8_4_;
      auVar217._0_8_ = auVar211._0_8_;
      auVar217._12_4_ = auVar211._12_4_;
      auVar174 = minps(auVar217,auVar147);
      auVar217 = minps(auVar235,auVar174);
      auVar235._8_4_ = auVar167._8_4_;
      auVar235._0_8_ = auVar167._0_8_;
      auVar235._12_4_ = auVar167._12_4_;
      auVar174 = minps(auVar235,auVar196);
      auVar203 = minps(auVar199,auVar174);
      local_2b8._4_4_ = local_2b8._4_4_ & uVar216 | ~uVar216 & auVar188._4_4_;
      local_2b8._0_4_ = local_2b8._0_4_ & uVar77 | ~uVar77 & auVar188._0_4_;
      local_2b8._8_4_ = local_2b8._8_4_ & uVar71 | ~uVar71 & auVar188._8_4_;
      local_2b8._12_4_ = local_2b8._12_4_ & uVar75 | ~uVar75 & auVar188._12_4_;
      auVar188._0_4_ = ~uVar77 & auVar217._0_4_;
      auVar188._4_4_ = ~uVar216 & auVar217._4_4_;
      auVar188._8_4_ = ~uVar71 & auVar217._8_4_;
      auVar188._12_4_ = ~uVar75 & auVar217._12_4_;
      auVar239._0_4_ = local_258._0_4_ & uVar77;
      auVar239._4_4_ = local_258._4_4_ & uVar216;
      auVar239._8_4_ = local_258._8_4_ & uVar71;
      auVar239._12_4_ = local_258._12_4_ & uVar75;
      local_258 = auVar239 | auVar188;
      auVar174._0_4_ = ~uVar77 & auVar203._0_4_;
      auVar174._4_4_ = ~uVar216 & auVar203._4_4_;
      auVar174._8_4_ = ~uVar71 & auVar203._8_4_;
      auVar174._12_4_ = ~uVar75 & auVar203._12_4_;
      auVar226._0_4_ = local_248._0_4_ & uVar77;
      auVar226._4_4_ = local_248._4_4_ & uVar216;
      auVar226._8_4_ = local_248._8_4_ & uVar71;
      auVar226._12_4_ = local_248._12_4_ & uVar75;
      local_248 = auVar226 | auVar174;
      auVar188 = maxps(auVar168,_local_228);
      auVar188 = maxps(auVar146,auVar188);
      auVar174 = maxps(auVar211,auVar147);
      auVar203 = maxps(auVar220,auVar174);
      auVar174 = maxps(auVar167,auVar196);
      auVar174 = maxps(auVar205,auVar174);
      local_278._4_4_ = local_278._4_4_ & uVar216 | ~uVar216 & auVar188._4_4_;
      local_278._0_4_ = uVar187 & uVar77 | ~uVar77 & auVar188._0_4_;
      local_278._8_4_ = uVar191 & uVar71 | ~uVar71 & auVar188._8_4_;
      local_278._12_4_ = uVar193 & uVar75 | ~uVar75 & auVar188._12_4_;
      local_268._4_4_ = local_268._4_4_ & uVar216 | ~uVar216 & auVar203._4_4_;
      local_268._0_4_ = uVar22 & uVar77 | ~uVar77 & auVar203._0_4_;
      local_268._8_4_ = uVar183 & uVar71 | ~uVar71 & auVar203._8_4_;
      local_268._12_4_ = uVar185 & uVar75 | ~uVar75 & auVar203._12_4_;
      auVar146._0_4_ = auVar158._0_4_ & uVar77;
      auVar146._4_4_ = auVar158._4_4_ & uVar216;
      auVar146._8_4_ = auVar158._8_4_ & uVar71;
      auVar146._12_4_ = auVar158._12_4_ & uVar75;
      auVar158._0_4_ = ~uVar77 & auVar174._0_4_;
      auVar158._4_4_ = ~uVar216 & auVar174._4_4_;
      auVar158._8_4_ = ~uVar71 & auVar174._8_4_;
      auVar158._12_4_ = ~uVar75 & auVar174._12_4_;
      auVar158 = auVar146 | auVar158;
      uVar21 = uVar21 + 4;
    }
    fVar155 = fVar155 + fVar150;
    fVar165 = fVar165 + fVar152;
    fVar170 = fVar170 + fVar177;
    fVar135 = fVar135 + fVar74;
    fVar115 = fVar115 + fVar76;
    fVar230 = fVar230 + fVar94;
    fVar173 = (fVar180 + fVar98) * 0.33333334 + fVar155;
    fVar29 = (fVar234 + fVar112) * 0.33333334 + fVar165;
    fVar70 = (fVar242 + fVar113) * 0.33333334 + fVar170;
    fVar74 = fVar135 - (fVar96 + fVar128) * 0.33333334;
    fVar72 = fVar115 - (fVar72 + fVar136) * 0.33333334;
    fVar76 = fVar230 - (fVar97 + fVar124) * 0.33333334;
    auVar220._4_4_ = local_2b8._0_4_;
    auVar220._0_4_ = local_2b8._4_4_;
    auVar220._8_4_ = local_2b8._12_4_;
    auVar220._12_4_ = local_2b8._8_4_;
    auVar188 = minps(auVar220,local_2b8);
    auVar85._0_8_ = auVar188._8_8_;
    auVar85._8_4_ = auVar188._0_4_;
    auVar85._12_4_ = auVar188._4_4_;
    auVar174 = minps(auVar85,auVar188);
    auVar52._4_4_ = local_258._0_4_;
    auVar52._0_4_ = local_258._4_4_;
    auVar52._8_4_ = local_258._12_4_;
    auVar52._12_4_ = local_258._8_4_;
    auVar188 = minps(auVar52,local_258);
    auVar148._0_8_ = auVar188._8_8_;
    auVar148._8_4_ = auVar188._0_4_;
    auVar148._12_4_ = auVar188._4_4_;
    auVar196 = minps(auVar148,auVar188);
    auVar53._4_4_ = local_248._0_4_;
    auVar53._0_4_ = local_248._4_4_;
    auVar53._8_4_ = local_248._12_4_;
    auVar53._12_4_ = local_248._8_4_;
    auVar188 = minps(auVar53,local_248);
    auVar54._0_8_ = auVar188._8_8_;
    auVar54._8_4_ = auVar188._0_4_;
    auVar54._12_4_ = auVar188._4_4_;
    auVar122._4_4_ = auVar196._0_4_;
    auVar122._0_4_ = auVar174._0_4_;
    auVar55._4_4_ = uVar187;
    auVar55._0_4_ = local_278._4_4_;
    auVar55._8_4_ = uVar193;
    auVar55._12_4_ = uVar191;
    auVar174 = maxps(auVar55,local_278);
    auVar86._0_8_ = auVar174._8_8_;
    auVar86._8_4_ = auVar174._0_4_;
    auVar86._12_4_ = auVar174._4_4_;
    auVar196 = maxps(auVar86,auVar174);
    auVar56._4_4_ = uVar22;
    auVar56._0_4_ = local_268._4_4_;
    auVar56._8_4_ = uVar185;
    auVar56._12_4_ = uVar183;
    auVar174 = maxps(auVar56,local_268);
    auVar149._0_8_ = auVar174._8_8_;
    auVar149._8_4_ = auVar174._0_4_;
    auVar149._12_4_ = auVar174._4_4_;
    auVar174 = maxps(auVar149,auVar174);
    auVar57._4_4_ = auVar158._0_4_;
    auVar57._0_4_ = auVar158._4_4_;
    auVar57._8_4_ = auVar158._12_4_;
    auVar57._12_4_ = auVar158._8_4_;
    auVar158 = maxps(auVar57,auVar158);
    auVar58._0_8_ = auVar158._8_8_;
    auVar58._8_4_ = auVar158._0_4_;
    auVar58._12_4_ = auVar158._4_4_;
    auVar134._4_4_ = auVar174._0_4_;
    auVar134._0_4_ = auVar196._0_4_;
    uVar21 = 0;
    local_248._8_8_ = 0xff800000ff800000;
    local_248._0_8_ = 0xff800000ff800000;
    local_278._8_8_ = 0xff800000ff800000;
    local_278._0_8_ = 0xff800000ff800000;
    local_268._8_8_ = 0xff800000ff800000;
    local_268._0_8_ = 0xff800000ff800000;
    local_2b8._8_8_ = 0x7f8000007f800000;
    local_2b8._0_8_ = 0x7f8000007f800000;
    local_238 = 0x7f800000;
    uStack_234 = 0x7f800000;
    uStack_230 = 0x7f800000;
    uStack_22c = 0x7f800000;
    local_258._8_8_ = 0x7f8000007f800000;
    local_258._0_8_ = 0x7f8000007f800000;
    while( true ) {
      uVar22 = local_278._0_4_;
      uVar183 = local_278._8_4_;
      uVar185 = local_278._12_4_;
      uVar187 = local_268._0_4_;
      uVar191 = local_268._8_4_;
      uVar193 = local_268._12_4_;
      if (7 < uVar21) break;
      uVar207 = (uint)uVar21;
      uVar77 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar95 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar216 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      uVar30 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
      lVar24 = uVar21 * 4;
      fVar94 = *(float *)(bezier_basis0 + lVar24 + 0x1dc);
      fVar96 = *(float *)(bezier_basis0 + lVar24 + 0x1e0);
      fVar97 = *(float *)(bezier_basis0 + lVar24 + 0x1e4);
      fVar137 = *(float *)(bezier_basis0 + lVar24 + 0x1e8);
      lVar24 = uVar21 * 4;
      fVar150 = *(float *)(bezier_basis0 + lVar24 + 0x660);
      fVar152 = *(float *)(bezier_basis0 + lVar24 + 0x664);
      fVar156 = *(float *)(bezier_basis0 + lVar24 + 0x668);
      fVar98 = *(float *)(bezier_basis0 + lVar24 + 0x66c);
      lVar24 = uVar21 * 4;
      fVar112 = *(float *)(bezier_basis0 + lVar24 + 0xae4);
      fVar113 = *(float *)(bezier_basis0 + lVar24 + 0xae8);
      fVar114 = *(float *)(bezier_basis0 + lVar24 + 0xaec);
      fVar128 = *(float *)(bezier_basis0 + lVar24 + 0xaf0);
      lVar24 = uVar21 * 4;
      fVar136 = *(float *)(bezier_basis0 + lVar24 + 0xf68);
      fVar124 = *(float *)(bezier_basis0 + lVar24 + 0xf6c);
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0xf70);
      fVar177 = *(float *)(bezier_basis0 + lVar24 + 0xf74);
      auVar212._0_4_ = fVar155 * fVar94 + fVar173 * fVar150 + fVar74 * fVar112 + fVar135 * fVar136;
      auVar212._4_4_ = fVar155 * fVar96 + fVar173 * fVar152 + fVar74 * fVar113 + fVar135 * fVar124;
      auVar212._8_4_ = fVar155 * fVar97 + fVar173 * fVar156 + fVar74 * fVar114 + fVar135 * fVar154;
      auVar212._12_4_ = fVar155 * fVar137 + fVar173 * fVar98 + fVar74 * fVar128 + fVar135 * fVar177;
      auVar163._0_4_ = fVar165 * fVar94 + fVar29 * fVar150 + fVar72 * fVar112 + fVar115 * fVar136;
      auVar163._4_4_ = fVar165 * fVar96 + fVar29 * fVar152 + fVar72 * fVar113 + fVar115 * fVar124;
      auVar163._8_4_ = fVar165 * fVar97 + fVar29 * fVar156 + fVar72 * fVar114 + fVar115 * fVar154;
      auVar163._12_4_ = fVar165 * fVar137 + fVar29 * fVar98 + fVar72 * fVar128 + fVar115 * fVar177;
      auVar221._0_4_ = fVar94 * fVar170 + fVar150 * fVar70 + fVar112 * fVar76 + fVar136 * fVar230;
      auVar221._4_4_ = fVar96 * fVar170 + fVar152 * fVar70 + fVar113 * fVar76 + fVar124 * fVar230;
      auVar221._8_4_ = fVar97 * fVar170 + fVar156 * fVar70 + fVar114 * fVar76 + fVar154 * fVar230;
      auVar221._12_4_ = fVar137 * fVar170 + fVar98 * fVar70 + fVar128 * fVar76 + fVar177 * fVar230;
      lVar24 = uVar21 * 4;
      fVar94 = *(float *)(bezier_basis0 + lVar24 + 0x13ec);
      fVar96 = *(float *)(bezier_basis0 + lVar24 + 0x13f0);
      fVar97 = *(float *)(bezier_basis0 + lVar24 + 0x13f4);
      fVar137 = *(float *)(bezier_basis0 + lVar24 + 0x13f8);
      lVar24 = uVar21 * 4;
      fVar150 = *(float *)(bezier_basis0 + lVar24 + 0x1870);
      fVar152 = *(float *)(bezier_basis0 + lVar24 + 0x1874);
      fVar156 = *(float *)(bezier_basis0 + lVar24 + 0x1878);
      fVar98 = *(float *)(bezier_basis0 + lVar24 + 0x187c);
      lVar24 = uVar21 * 4;
      fVar112 = *(float *)(bezier_basis0 + lVar24 + 0x1cf4);
      fVar113 = *(float *)(bezier_basis0 + lVar24 + 0x1cf8);
      fVar114 = *(float *)(bezier_basis0 + lVar24 + 0x1cfc);
      fVar128 = *(float *)(bezier_basis0 + lVar24 + 0x1d00);
      lVar24 = uVar21 * 4;
      fVar136 = *(float *)(bezier_basis0 + lVar24 + 0x2178);
      fVar124 = *(float *)(bezier_basis0 + lVar24 + 0x217c);
      fVar154 = *(float *)(bezier_basis0 + lVar24 + 0x2180);
      fVar177 = *(float *)(bezier_basis0 + lVar24 + 0x2184);
      fVar184 = fVar155 * fVar94 + fVar173 * fVar150 + fVar74 * fVar112 + fVar135 * fVar136;
      fVar151 = fVar155 * fVar96 + fVar173 * fVar152 + fVar74 * fVar113 + fVar135 * fVar124;
      fVar153 = fVar155 * fVar97 + fVar173 * fVar156 + fVar74 * fVar114 + fVar135 * fVar154;
      fVar171 = fVar155 * fVar137 + fVar173 * fVar98 + fVar74 * fVar128 + fVar135 * fVar177;
      fVar234 = fVar165 * fVar94 + fVar29 * fVar150 + fVar72 * fVar112 + fVar115 * fVar136;
      fVar241 = fVar165 * fVar96 + fVar29 * fVar152 + fVar72 * fVar113 + fVar115 * fVar124;
      fVar180 = fVar165 * fVar97 + fVar29 * fVar156 + fVar72 * fVar114 + fVar115 * fVar154;
      fVar242 = fVar165 * fVar137 + fVar29 * fVar98 + fVar72 * fVar128 + fVar115 * fVar177;
      fVar94 = fVar94 * fVar170 + fVar150 * fVar70 + fVar112 * fVar76 + fVar136 * fVar230;
      fVar96 = fVar96 * fVar170 + fVar152 * fVar70 + fVar113 * fVar76 + fVar124 * fVar230;
      fVar97 = fVar97 * fVar170 + fVar156 * fVar70 + fVar114 * fVar76 + fVar154 * fVar230;
      fVar137 = fVar137 * fVar170 + fVar98 * fVar70 + fVar128 * fVar76 + fVar177 * fVar230;
      uVar71 = -(uint)(uVar207 == 0);
      uVar73 = -(uint)(uVar207 == 1);
      uVar75 = -(uint)(uVar207 == 2);
      uVar194 = -(uint)(uVar207 == 3);
      uVar200 = -(uint)(uVar207 == 7);
      uVar201 = -(uint)(uVar207 == 6);
      uVar202 = -(uint)(uVar207 == 5);
      uVar207 = -(uint)(uVar207 == 4);
      local_228._4_4_ = (float)(~uVar201 & (uint)fVar151) * 0.055555556 + auVar212._4_4_;
      local_228._0_4_ = (float)(~uVar200 & (uint)fVar184) * 0.055555556 + auVar212._0_4_;
      fStack_220 = (float)(~uVar202 & (uint)fVar153) * 0.055555556 + auVar212._8_4_;
      fStack_21c = (float)(~uVar207 & (uint)fVar171) * 0.055555556 + auVar212._12_4_;
      auVar174 = minps(local_2b8,auVar212);
      auVar196 = maxps(local_248,auVar212);
      auVar206._0_8_ =
           CONCAT44(auVar212._4_4_ - (float)(~uVar73 & (uint)fVar151) * 0.055555556,
                    auVar212._0_4_ - (float)(~uVar71 & (uint)fVar184) * 0.055555556);
      auVar206._8_4_ = auVar212._8_4_ - (float)(~uVar75 & (uint)fVar153) * 0.055555556;
      auVar206._12_4_ = auVar212._12_4_ - (float)(~uVar194 & (uint)fVar171) * 0.055555556;
      auVar213._0_4_ = (float)(~uVar200 & (uint)fVar234) * 0.055555556 + auVar163._0_4_;
      auVar213._4_4_ = (float)(~uVar201 & (uint)fVar241) * 0.055555556 + auVar163._4_4_;
      auVar213._8_4_ = (float)(~uVar202 & (uint)fVar180) * 0.055555556 + auVar163._8_4_;
      auVar213._12_4_ = (float)(~uVar207 & (uint)fVar242) * 0.055555556 + auVar163._12_4_;
      auVar15._4_4_ = uStack_234;
      auVar15._0_4_ = local_238;
      auVar15._8_4_ = uStack_230;
      auVar15._12_4_ = uStack_22c;
      auVar203 = minps(auVar15,auVar163);
      auVar199 = maxps(local_278,auVar163);
      auVar164._0_8_ =
           CONCAT44(auVar163._4_4_ - (float)(~uVar73 & (uint)fVar241) * 0.055555556,
                    auVar163._0_4_ - (float)(~uVar71 & (uint)fVar234) * 0.055555556);
      auVar164._8_4_ = auVar163._8_4_ - (float)(~uVar75 & (uint)fVar180) * 0.055555556;
      auVar164._12_4_ = auVar163._12_4_ - (float)(~uVar194 & (uint)fVar242) * 0.055555556;
      auVar227._0_8_ =
           CONCAT44((float)(~uVar201 & (uint)fVar96) * 0.055555556 + auVar221._4_4_,
                    (float)(~uVar200 & (uint)fVar94) * 0.055555556 + auVar221._0_4_);
      auVar227._8_4_ = (float)(~uVar202 & (uint)fVar97) * 0.055555556 + auVar221._8_4_;
      auVar227._12_4_ = (float)(~uVar207 & (uint)fVar137) * 0.055555556 + auVar221._12_4_;
      auVar59._8_4_ = auVar227._8_4_;
      auVar59._0_8_ = auVar227._0_8_;
      auVar59._12_4_ = auVar227._12_4_;
      auVar167 = minps(local_258,auVar221);
      auVar235 = maxps(local_268,auVar221);
      auVar222._0_8_ =
           CONCAT44(auVar221._4_4_ - (float)(~uVar73 & (uint)fVar96) * 0.055555556,
                    auVar221._0_4_ - (float)(~uVar71 & (uint)fVar94) * 0.055555556);
      auVar222._8_4_ = auVar221._8_4_ - (float)(~uVar75 & (uint)fVar97) * 0.055555556;
      auVar222._12_4_ = auVar221._12_4_ - (float)(~uVar194 & (uint)fVar137) * 0.055555556;
      auVar104._8_4_ = auVar206._8_4_;
      auVar104._0_8_ = auVar206._0_8_;
      auVar104._12_4_ = auVar206._12_4_;
      auVar217 = minps(auVar104,_local_228);
      auVar217 = minps(auVar174,auVar217);
      auVar105._8_4_ = auVar164._8_4_;
      auVar105._0_8_ = auVar164._0_8_;
      auVar105._12_4_ = auVar164._12_4_;
      auVar174 = minps(auVar105,auVar213);
      auVar174 = minps(auVar203,auVar174);
      auVar106._8_4_ = auVar222._8_4_;
      auVar106._0_8_ = auVar222._0_8_;
      auVar106._12_4_ = auVar222._12_4_;
      auVar203 = minps(auVar106,auVar59);
      auVar203 = minps(auVar167,auVar203);
      auVar60._0_4_ = ~uVar77 & auVar217._0_4_;
      auVar60._4_4_ = ~uVar95 & auVar217._4_4_;
      auVar60._8_4_ = ~uVar216 & auVar217._8_4_;
      auVar60._12_4_ = ~uVar30 & auVar217._12_4_;
      auVar228._0_4_ = local_2b8._0_4_ & uVar77;
      auVar228._4_4_ = local_2b8._4_4_ & uVar95;
      auVar228._8_4_ = local_2b8._8_4_ & uVar216;
      auVar228._12_4_ = local_2b8._12_4_ & uVar30;
      local_2b8 = auVar228 | auVar60;
      local_238 = local_238 & uVar77 | ~uVar77 & auVar174._0_4_;
      uStack_234 = uStack_234 & uVar95 | ~uVar95 & auVar174._4_4_;
      uStack_230 = uStack_230 & uVar216 | ~uVar216 & auVar174._8_4_;
      uStack_22c = uStack_22c & uVar30 | ~uVar30 & auVar174._12_4_;
      auVar87._0_4_ = ~uVar77 & auVar203._0_4_;
      auVar87._4_4_ = ~uVar95 & auVar203._4_4_;
      auVar87._8_4_ = ~uVar216 & auVar203._8_4_;
      auVar87._12_4_ = ~uVar30 & auVar203._12_4_;
      auVar169._0_4_ = local_258._0_4_ & uVar77;
      auVar169._4_4_ = local_258._4_4_ & uVar95;
      auVar169._8_4_ = local_258._8_4_ & uVar216;
      auVar169._12_4_ = local_258._12_4_ & uVar30;
      local_258 = auVar169 | auVar87;
      auVar174 = maxps(auVar206,_local_228);
      auVar174 = maxps(auVar196,auVar174);
      auVar196 = maxps(auVar164,auVar213);
      auVar203 = maxps(auVar199,auVar196);
      auVar196 = maxps(auVar222,auVar227);
      auVar196 = maxps(auVar235,auVar196);
      auVar107._0_4_ = ~uVar77 & auVar174._0_4_;
      auVar107._4_4_ = ~uVar95 & auVar174._4_4_;
      auVar107._8_4_ = ~uVar216 & auVar174._8_4_;
      auVar107._12_4_ = ~uVar30 & auVar174._12_4_;
      auVar240._0_4_ = local_248._0_4_ & uVar77;
      auVar240._4_4_ = local_248._4_4_ & uVar95;
      auVar240._8_4_ = local_248._8_4_ & uVar216;
      auVar240._12_4_ = local_248._12_4_ & uVar30;
      local_248 = auVar240 | auVar107;
      local_278._4_4_ = local_278._4_4_ & uVar95 | ~uVar95 & auVar203._4_4_;
      local_278._0_4_ = uVar22 & uVar77 | ~uVar77 & auVar203._0_4_;
      local_278._8_4_ = uVar183 & uVar216 | ~uVar216 & auVar203._8_4_;
      local_278._12_4_ = uVar185 & uVar30 | ~uVar30 & auVar203._12_4_;
      local_268._4_4_ = local_268._4_4_ & uVar95 | ~uVar95 & auVar196._4_4_;
      local_268._0_4_ = uVar187 & uVar77 | ~uVar77 & auVar196._0_4_;
      local_268._8_4_ = uVar191 & uVar216 | ~uVar216 & auVar196._8_4_;
      local_268._12_4_ = uVar193 & uVar30 | ~uVar30 & auVar196._12_4_;
      uVar21 = uVar21 + 4;
    }
    auVar188 = minps(auVar54,auVar188);
    auVar122._8_4_ = auVar188._0_4_;
    auVar122._12_4_ = 0;
    auVar158 = maxps(auVar58,auVar158);
    auVar134._8_4_ = auVar158._0_4_;
    auVar134._12_4_ = 0;
    auVar61._4_4_ = local_2b8._0_4_;
    auVar61._0_4_ = local_2b8._4_4_;
    auVar61._8_4_ = local_2b8._12_4_;
    auVar61._12_4_ = local_2b8._8_4_;
    auVar158 = minps(auVar61,local_2b8);
    auVar88._0_8_ = auVar158._8_8_;
    auVar88._8_4_ = auVar158._0_4_;
    auVar88._12_4_ = auVar158._4_4_;
    auVar188 = minps(auVar88,auVar158);
    auVar16._4_4_ = uStack_234;
    auVar16._0_4_ = local_238;
    auVar16._8_4_ = uStack_230;
    auVar16._12_4_ = uStack_22c;
    auVar62._4_4_ = local_238;
    auVar62._0_4_ = uStack_234;
    auVar62._8_4_ = uStack_22c;
    auVar62._12_4_ = uStack_230;
    auVar158 = minps(auVar62,auVar16);
    auVar108._0_8_ = auVar158._8_8_;
    auVar108._8_4_ = auVar158._0_4_;
    auVar108._12_4_ = auVar158._4_4_;
    auVar174 = minps(auVar108,auVar158);
    auVar63._4_4_ = local_258._0_4_;
    auVar63._0_4_ = local_258._4_4_;
    auVar63._8_4_ = local_258._12_4_;
    auVar63._12_4_ = local_258._8_4_;
    auVar158 = minps(auVar63,local_258);
    auVar89._0_8_ = auVar158._8_8_;
    auVar89._8_4_ = auVar158._0_4_;
    auVar89._12_4_ = auVar158._4_4_;
    auVar158 = minps(auVar89,auVar158);
    auVar109._4_4_ = auVar174._0_4_;
    auVar109._0_4_ = auVar188._0_4_;
    auVar109._8_4_ = auVar158._0_4_;
    auVar109._12_4_ = 0;
    auVar196 = minps(auVar122,auVar109);
    auVar64._4_4_ = local_248._0_4_;
    auVar64._0_4_ = local_248._4_4_;
    auVar64._8_4_ = local_248._12_4_;
    auVar64._12_4_ = local_248._8_4_;
    auVar158 = maxps(auVar64,local_248);
    auVar90._0_8_ = auVar158._8_8_;
    auVar90._8_4_ = auVar158._0_4_;
    auVar90._12_4_ = auVar158._4_4_;
    auVar188 = maxps(auVar90,auVar158);
    auVar65._4_4_ = uVar22;
    auVar65._0_4_ = local_278._4_4_;
    auVar65._8_4_ = uVar185;
    auVar65._12_4_ = uVar183;
    auVar158 = maxps(auVar65,local_278);
    auVar110._0_8_ = auVar158._8_8_;
    auVar110._8_4_ = auVar158._0_4_;
    auVar110._12_4_ = auVar158._4_4_;
    auVar174 = maxps(auVar110,auVar158);
    auVar66._4_4_ = uVar187;
    auVar66._0_4_ = local_268._4_4_;
    auVar66._8_4_ = uVar193;
    auVar66._12_4_ = uVar191;
    auVar158 = maxps(auVar66,local_268);
    auVar91._0_8_ = auVar158._8_8_;
    auVar91._8_4_ = auVar158._0_4_;
    auVar91._12_4_ = auVar158._4_4_;
    auVar158 = maxps(auVar91,auVar158);
    auVar111._4_4_ = auVar174._0_4_;
    auVar111._0_4_ = auVar188._0_4_;
    auVar111._8_4_ = auVar158._0_4_;
    auVar111._12_4_ = 0;
    auVar188 = maxps(auVar134,auVar111);
    auVar67._0_8_ = auVar196._0_8_ & 0x7fffffff7fffffff;
    auVar67._8_4_ = ABS(auVar196._8_4_);
    auVar67._12_4_ = auVar196._12_4_ & 0x7fffffff;
    auVar92._0_8_ = auVar188._0_8_ & 0x7fffffff7fffffff;
    auVar92._8_4_ = ABS(auVar188._8_4_);
    auVar92._12_4_ = auVar188._12_4_ & 0x7fffffff;
    auVar158 = maxps(auVar67,auVar92);
    fVar173 = auVar158._4_4_;
    if (auVar158._4_4_ <= auVar158._0_4_) {
      fVar173 = auVar158._0_4_;
    }
    auVar68._8_8_ = auVar158._8_8_;
    auVar68._0_8_ = auVar158._8_8_;
    if (auVar158._8_4_ <= fVar173) {
      auVar68._0_4_ = fVar173;
    }
    fVar173 = auVar68._0_4_ * 4.7683716e-07;
    aVar123._0_4_ = auVar196._0_4_ - fVar173;
    aVar123._4_4_ = auVar196._4_4_ - fVar173;
    aVar123._8_4_ = auVar196._8_4_ - fVar173;
    aVar69._0_4_ = fVar173 + auVar188._0_4_;
    aVar69._4_4_ = fVar173 + auVar188._4_4_;
    aVar69._8_4_ = fVar173 + auVar188._8_4_;
    aVar123.m128[3] = (float)geomID;
    aVar69.m128[3] = (float)uVar25;
    auVar93._0_4_ = aVar123._0_4_ + aVar69._0_4_;
    auVar93._4_4_ = aVar123._4_4_ + aVar69._4_4_;
    auVar93._8_4_ = aVar123._8_4_ + aVar69._8_4_;
    auVar93._12_4_ = (float)geomID + (float)uVar25;
    local_88 = minps(local_88,auVar93);
    local_78 = maxps(local_78,auVar93);
    local_a8 = minps(local_a8,(undefined1  [16])aVar123);
    prims[local_b0].lower.field_0 = aVar123;
    local_98 = maxps(local_98,(undefined1  [16])aVar69);
    prims[local_b0].upper.field_0 = aVar69;
    local_b8 = local_b8 + 1;
    local_b0 = local_b0 + 1;
  }
  else {
    pcVar8 = pBVar6[lVar24].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar6[lVar24].super_RawBufferView.stride;
    lVar19 = sVar9 * uVar21;
    lVar17 = sVar9 * uVar28;
    auVar31._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar27 + 0xc)));
    auVar31._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar19 + 0xc)));
    auVar31._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + lVar17 + 0xc)));
    auVar31._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar8 + sVar9 * uVar26 + 0xc)));
    uVar22 = movmskps((int)pCVar23,auVar31);
    pCVar23 = (CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
               *)(ulong)uVar22;
    if (uVar22 == 0) {
      auVar158 = *(undefined1 (*) [16])(pcVar8 + lVar19);
      fVar29 = auVar158._0_4_;
      fVar70 = auVar158._4_4_;
      fVar72 = auVar158._8_4_;
      fVar74 = auVar158._12_4_;
      auVar99._0_4_ = -(uint)(fVar29 < 1.844e+18 && -1.844e+18 < fVar29);
      auVar99._4_4_ = -(uint)(fVar70 < 1.844e+18 && -1.844e+18 < fVar70);
      auVar99._8_4_ = -(uint)(fVar72 < 1.844e+18 && -1.844e+18 < fVar72);
      auVar99._12_4_ = -(uint)(fVar74 < 1.844e+18 && -1.844e+18 < fVar74);
      uVar18 = movmskps((int)lVar19,auVar99);
      if ((~(byte)uVar18 & 7) == 0) {
        auVar158 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar27);
        fVar76 = auVar158._0_4_;
        fVar94 = auVar158._4_4_;
        fVar96 = auVar158._8_4_;
        fVar97 = auVar158._12_4_;
        auVar117._0_4_ = -(uint)(fVar76 < 1.844e+18 && -1.844e+18 < fVar76);
        auVar117._4_4_ = -(uint)(fVar94 < 1.844e+18 && -1.844e+18 < fVar94);
        auVar117._8_4_ = -(uint)(fVar96 < 1.844e+18 && -1.844e+18 < fVar96);
        auVar117._12_4_ = -(uint)(fVar97 < 1.844e+18 && -1.844e+18 < fVar97);
        uVar18 = movmskps(CONCAT31((int3)((uint)uVar18 >> 8),~(byte)uVar18),auVar117);
        if ((~(byte)uVar18 & 7) == 0) {
          auVar158 = *(undefined1 (*) [16])(pcVar8 + lVar17);
          fVar137 = auVar158._0_4_;
          fVar150 = auVar158._4_4_;
          fVar152 = auVar158._8_4_;
          fVar156 = auVar158._12_4_;
          auVar118._0_4_ = -(uint)(fVar137 < 1.844e+18 && -1.844e+18 < fVar137);
          auVar118._4_4_ = -(uint)(fVar150 < 1.844e+18 && -1.844e+18 < fVar150);
          auVar118._8_4_ = -(uint)(fVar152 < 1.844e+18 && -1.844e+18 < fVar152);
          auVar118._12_4_ = -(uint)(fVar156 < 1.844e+18 && -1.844e+18 < fVar156);
          uVar18 = movmskps((int)lVar17,auVar118);
          if ((~(byte)uVar18 & 7) == 0) {
            auVar158 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar26);
            fVar98 = auVar158._0_4_;
            fVar112 = auVar158._4_4_;
            fVar113 = auVar158._8_4_;
            fVar114 = auVar158._12_4_;
            auVar129._0_4_ = -(uint)(fVar98 < 1.844e+18 && -1.844e+18 < fVar98);
            auVar129._4_4_ = -(uint)(fVar112 < 1.844e+18 && -1.844e+18 < fVar112);
            auVar129._8_4_ = -(uint)(fVar113 < 1.844e+18 && -1.844e+18 < fVar113);
            auVar129._12_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
            uVar18 = movmskps(CONCAT31((int3)((uint)uVar18 >> 8),~(byte)uVar18),auVar129);
            if ((~(byte)uVar18 & 7) == 0) {
              pcVar8 = pBVar7[lVar24].super_RawBufferView.ptr_ofs;
              sVar9 = pBVar7[lVar24].super_RawBufferView.stride;
              auVar158 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar21);
              fVar128 = auVar158._0_4_;
              fVar135 = auVar158._4_4_;
              fVar136 = auVar158._8_4_;
              auVar157._0_4_ = -(uint)(fVar128 < 1.844e+18 && -1.844e+18 < fVar128);
              auVar157._4_4_ = -(uint)(fVar135 < 1.844e+18 && -1.844e+18 < fVar135);
              auVar157._8_4_ = -(uint)(fVar136 < 1.844e+18 && -1.844e+18 < fVar136);
              auVar157._12_4_ = -(uint)(auVar158._12_4_ < 1.844e+18 && -1.844e+18 < auVar158._12_4_)
              ;
              uVar18 = movmskps((int)(sVar9 * uVar21),auVar157);
              if ((~(byte)uVar18 & 7) == 0) {
                auVar158 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar27);
                fVar115 = auVar158._0_4_;
                fVar124 = auVar158._4_4_;
                fVar230 = auVar158._8_4_;
                auVar166._0_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
                auVar166._4_4_ = -(uint)(fVar124 < 1.844e+18 && -1.844e+18 < fVar124);
                auVar166._8_4_ = -(uint)(fVar230 < 1.844e+18 && -1.844e+18 < fVar230);
                auVar166._12_4_ =
                     -(uint)(auVar158._12_4_ < 1.844e+18 && -1.844e+18 < auVar158._12_4_);
                uVar18 = movmskps((int)(sVar9 * uVar27),auVar166);
                if ((~(byte)uVar18 & 7) == 0) goto code_r0x001fbc96;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_001fcab2;
code_r0x001fbc96:
  fVar74 = fVar74 * fVar173;
  fVar114 = fVar114 * fVar173;
  pfVar1 = (float *)(pcVar8 + sVar9 * uVar28);
  pfVar2 = (float *)(pcVar8 + sVar9 * uVar26);
  fVar154 = *pfVar2;
  fVar155 = pfVar2[1];
  fVar165 = pfVar2[2];
  fVar232 = fVar156 * fVar173 * 0.0;
  fVar170 = fVar98 * 0.0 + fVar137 * 0.0;
  fVar177 = fVar112 * 0.0 + fVar150 * 0.0;
  fVar180 = fVar113 * 0.0 + fVar152 * 0.0;
  fVar184 = fVar114 * 0.0 + fVar232;
  fVar186 = fVar76 * 0.0;
  fVar189 = fVar94 * 0.0;
  fVar190 = fVar96 * 0.0;
  fVar192 = fVar97 * fVar173 * 0.0;
  fVar234 = fVar186 + fVar170 + fVar29;
  fVar241 = fVar189 + fVar177 + fVar70;
  fVar242 = fVar190 + fVar180 + fVar72;
  fVar243 = fVar192 + fVar184 + fVar74;
  fVar76 = (fVar76 * 3.0 + fVar170) - fVar29 * 3.0;
  fVar170 = (fVar94 * 3.0 + fVar177) - fVar70 * 3.0;
  fVar177 = (fVar96 * 3.0 + fVar180) - fVar72 * 3.0;
  fVar94 = (fVar97 * fVar173 * 3.0 + fVar184) - fVar74 * 3.0;
  fVar184 = *pfVar1 * 0.0;
  fVar151 = pfVar1[1] * 0.0;
  fVar153 = pfVar1[2] * 0.0;
  fVar96 = fVar154 * 0.0 + fVar184;
  fVar97 = fVar155 * 0.0 + fVar151;
  fVar180 = fVar165 * 0.0 + fVar153;
  fVar171 = fVar115 * 0.0;
  fVar178 = fVar124 * 0.0;
  fVar181 = fVar230 * 0.0;
  fVar172 = fVar171 + fVar96 + fVar128;
  fVar179 = fVar178 + fVar97 + fVar135;
  fVar182 = fVar181 + fVar180 + fVar136;
  fVar96 = (fVar115 * 3.0 + fVar96) - fVar128 * 3.0;
  fVar97 = (fVar124 * 3.0 + fVar97) - fVar135 * 3.0;
  fVar180 = (fVar230 * 3.0 + fVar180) - fVar136 * 3.0;
  fVar115 = fVar137 * 0.0 + fVar98 + fVar186 + fVar29 * 0.0;
  fVar124 = fVar150 * 0.0 + fVar112 + fVar189 + fVar70 * 0.0;
  fVar230 = fVar152 * 0.0 + fVar113 + fVar190 + fVar72 * 0.0;
  fVar232 = fVar232 + fVar114 + fVar192 + fVar74 * 0.0;
  fVar137 = ((fVar98 * 3.0 - fVar137 * 3.0) + fVar186) - fVar29 * 0.0;
  fVar150 = ((fVar112 * 3.0 - fVar150 * 3.0) + fVar189) - fVar70 * 0.0;
  fVar152 = ((fVar113 * 3.0 - fVar152 * 3.0) + fVar190) - fVar72 * 0.0;
  fVar156 = ((fVar114 * 3.0 - fVar156 * fVar173 * 3.0) + fVar192) - fVar74 * 0.0;
  fVar29 = fVar184 + fVar154 + fVar171 + fVar128 * 0.0;
  fVar70 = fVar151 + fVar155 + fVar178 + fVar135 * 0.0;
  fVar72 = fVar153 + fVar165 + fVar181 + fVar136 * 0.0;
  fVar74 = ((fVar154 * 3.0 - *pfVar1 * 3.0) + fVar171) - fVar128 * 0.0;
  fVar114 = ((fVar155 * 3.0 - pfVar1[1] * 3.0) + fVar178) - fVar135 * 0.0;
  fVar128 = ((fVar165 * 3.0 - pfVar1[2] * 3.0) + fVar181) - fVar136 * 0.0;
  fVar151 = fVar172 * fVar170 - fVar179 * fVar76;
  fVar184 = fVar179 * fVar177 - fVar182 * fVar170;
  fVar171 = fVar182 * fVar76 - fVar172 * fVar177;
  fVar98 = fVar170 * fVar96 - fVar97 * fVar76;
  fVar97 = fVar177 * fVar97 - fVar180 * fVar170;
  fVar112 = fVar76 * fVar180 - fVar96 * fVar177;
  fVar113 = fVar29 * fVar150 - fVar70 * fVar137;
  fVar135 = fVar70 * fVar152 - fVar72 * fVar150;
  fVar154 = fVar72 * fVar137 - fVar29 * fVar152;
  fVar29 = fVar150 * fVar74 - fVar114 * fVar137;
  fVar72 = fVar152 * fVar114 - fVar128 * fVar150;
  fVar74 = fVar137 * fVar128 - fVar74 * fVar152;
  fVar172 = fVar171 * fVar171 + fVar184 * fVar184 + fVar151 * fVar151;
  auVar188 = ZEXT416((uint)fVar172);
  auVar158 = rsqrtss(ZEXT416((uint)fVar172),auVar188);
  fVar70 = auVar158._0_4_;
  fVar153 = fVar70 * 1.5 - fVar70 * fVar70 * fVar172 * 0.5 * fVar70;
  fVar179 = fVar151 * fVar98 + fVar171 * fVar112 + fVar184 * fVar97;
  auVar158 = rcpss(auVar188,auVar188);
  fVar96 = (2.0 - fVar172 * auVar158._0_4_) * auVar158._0_4_;
  fVar165 = fVar154 * fVar154 + fVar135 * fVar135 + fVar113 * fVar113;
  auVar158 = ZEXT416((uint)fVar165);
  auVar188 = rsqrtss(ZEXT416((uint)fVar165),auVar158);
  fVar70 = auVar188._0_4_;
  fVar114 = fVar70 * 1.5 - fVar70 * fVar70 * fVar165 * 0.5 * fVar70;
  fVar178 = fVar113 * fVar29 + fVar154 * fVar74 + fVar135 * fVar72;
  auVar158 = rcpss(auVar158,auVar158);
  fVar70 = (2.0 - fVar165 * auVar158._0_4_) * auVar158._0_4_;
  fVar128 = fVar243 * fVar184 * fVar153;
  fVar136 = fVar243 * fVar171 * fVar153;
  fVar155 = fVar243 * fVar151 * fVar153;
  fVar181 = fVar234 - fVar128;
  fVar182 = fVar241 - fVar136;
  fVar186 = fVar242 - fVar155;
  fVar180 = fVar243 * fVar96 * (fVar172 * fVar97 - fVar179 * fVar184) * fVar153 +
            fVar94 * fVar184 * fVar153;
  fVar184 = fVar243 * fVar96 * (fVar172 * fVar112 - fVar179 * fVar171) * fVar153 +
            fVar94 * fVar171 * fVar153;
  fVar151 = fVar243 * fVar96 * (fVar172 * fVar98 - fVar179 * fVar151) * fVar153 +
            fVar94 * fVar151 * fVar153;
  fVar94 = fVar232 * fVar135 * fVar114;
  fVar96 = fVar232 * fVar154 * fVar114;
  fVar97 = fVar232 * fVar113 * fVar114;
  fVar153 = fVar115 - fVar94;
  fVar171 = fVar124 - fVar96;
  fVar172 = fVar230 - fVar97;
  fVar98 = fVar232 * fVar70 * (fVar165 * fVar72 - fVar178 * fVar135) * fVar114 +
           fVar156 * fVar135 * fVar114;
  fVar74 = fVar232 * fVar70 * (fVar165 * fVar74 - fVar178 * fVar154) * fVar114 +
           fVar156 * fVar154 * fVar114;
  fVar156 = fVar232 * fVar70 * (fVar165 * fVar29 - fVar178 * fVar113) * fVar114 +
            fVar156 * fVar113 * fVar114;
  fVar112 = (fVar76 - fVar180) * 0.33333334 + fVar181;
  fVar113 = (fVar170 - fVar184) * 0.33333334 + fVar182;
  fVar114 = (fVar177 - fVar151) * 0.33333334 + fVar186;
  fVar29 = fVar153 - (fVar137 - fVar98) * 0.33333334;
  fVar70 = fVar171 - (fVar150 - fVar74) * 0.33333334;
  fVar72 = fVar172 - (fVar152 - fVar156) * 0.33333334;
  uVar20 = 0;
  local_288 = _DAT_01f45a40;
  _local_228 = _DAT_01f45a40;
  local_2b8._8_8_ = 0x7f8000007f800000;
  local_2b8._0_8_ = 0x7f8000007f800000;
  local_278._8_8_ = 0x7f8000007f800000;
  local_278._0_8_ = 0x7f8000007f800000;
  local_268._8_8_ = 0x7f8000007f800000;
  local_268._0_8_ = 0x7f8000007f800000;
  auVar120 = _DAT_01f45a40;
  while( true ) {
    uVar187 = local_278._0_4_;
    uVar191 = local_278._8_4_;
    uVar193 = local_278._12_4_;
    uVar207 = local_228._0_4_;
    uVar77 = local_228._8_4_;
    uVar95 = local_228._12_4_;
    uVar22 = local_268._0_4_;
    uVar183 = local_268._8_4_;
    uVar185 = local_268._12_4_;
    if (7 < uVar20) break;
    uVar216 = (uint)uVar20;
    uVar30 = -(uint)(-0x7ffffff9 < (int)(uVar216 ^ 0x80000000));
    uVar71 = -(uint)(-0x7ffffff9 < (int)(uVar216 ^ 0x80000000));
    uVar73 = -(uint)(-0x7ffffff9 < (int)(uVar216 ^ 0x80000000));
    uVar75 = -(uint)(-0x7ffffff9 < (int)(uVar216 ^ 0x80000000));
    lVar17 = uVar20 * 4;
    fVar135 = *(float *)(bezier_basis0 + lVar17 + 0x1dc);
    fVar154 = *(float *)(bezier_basis0 + lVar17 + 0x1e0);
    fVar165 = *(float *)(bezier_basis0 + lVar17 + 0x1e4);
    fVar178 = *(float *)(bezier_basis0 + lVar17 + 0x1e8);
    lVar17 = uVar20 * 4;
    fVar179 = *(float *)(bezier_basis0 + lVar17 + 0x660);
    fVar189 = *(float *)(bezier_basis0 + lVar17 + 0x664);
    fVar190 = *(float *)(bezier_basis0 + lVar17 + 0x668);
    fVar192 = *(float *)(bezier_basis0 + lVar17 + 0x66c);
    lVar17 = uVar20 * 4;
    fVar232 = *(float *)(bezier_basis0 + lVar17 + 0xae4);
    fVar243 = *(float *)(bezier_basis0 + lVar17 + 0xae8);
    fVar10 = *(float *)(bezier_basis0 + lVar17 + 0xaec);
    fVar11 = *(float *)(bezier_basis0 + lVar17 + 0xaf0);
    lVar17 = uVar20 * 4;
    fVar12 = *(float *)(bezier_basis0 + lVar17 + 0xf68);
    fVar13 = *(float *)(bezier_basis0 + lVar17 + 0xf6c);
    fVar14 = *(float *)(bezier_basis0 + lVar17 + 0xf70);
    fVar138 = *(float *)(bezier_basis0 + lVar17 + 0xf74);
    auVar159._0_4_ = fVar181 * fVar135 + fVar112 * fVar179 + fVar29 * fVar232 + fVar153 * fVar12;
    auVar159._4_4_ = fVar181 * fVar154 + fVar112 * fVar189 + fVar29 * fVar243 + fVar153 * fVar13;
    auVar159._8_4_ = fVar181 * fVar165 + fVar112 * fVar190 + fVar29 * fVar10 + fVar153 * fVar14;
    auVar159._12_4_ = fVar181 * fVar178 + fVar112 * fVar192 + fVar29 * fVar11 + fVar153 * fVar138;
    auVar130._0_4_ = fVar182 * fVar135 + fVar113 * fVar179 + fVar70 * fVar232 + fVar171 * fVar12;
    auVar130._4_4_ = fVar182 * fVar154 + fVar113 * fVar189 + fVar70 * fVar243 + fVar171 * fVar13;
    auVar130._8_4_ = fVar182 * fVar165 + fVar113 * fVar190 + fVar70 * fVar10 + fVar171 * fVar14;
    auVar130._12_4_ = fVar182 * fVar178 + fVar113 * fVar192 + fVar70 * fVar11 + fVar171 * fVar138;
    auVar139._0_4_ = fVar135 * fVar186 + fVar179 * fVar114 + fVar232 * fVar72 + fVar12 * fVar172;
    auVar139._4_4_ = fVar154 * fVar186 + fVar189 * fVar114 + fVar243 * fVar72 + fVar13 * fVar172;
    auVar139._8_4_ = fVar165 * fVar186 + fVar190 * fVar114 + fVar10 * fVar72 + fVar14 * fVar172;
    auVar139._12_4_ = fVar178 * fVar186 + fVar192 * fVar114 + fVar11 * fVar72 + fVar138 * fVar172;
    lVar17 = uVar20 * 4;
    fVar135 = *(float *)(bezier_basis0 + lVar17 + 0x13ec);
    fVar154 = *(float *)(bezier_basis0 + lVar17 + 0x13f0);
    fVar165 = *(float *)(bezier_basis0 + lVar17 + 0x13f4);
    fVar178 = *(float *)(bezier_basis0 + lVar17 + 0x13f8);
    lVar17 = uVar20 * 4;
    fVar179 = *(float *)(bezier_basis0 + lVar17 + 0x1870);
    fVar189 = *(float *)(bezier_basis0 + lVar17 + 0x1874);
    fVar190 = *(float *)(bezier_basis0 + lVar17 + 0x1878);
    fVar192 = *(float *)(bezier_basis0 + lVar17 + 0x187c);
    lVar17 = uVar20 * 4;
    fVar232 = *(float *)(bezier_basis0 + lVar17 + 0x1cf4);
    fVar243 = *(float *)(bezier_basis0 + lVar17 + 0x1cf8);
    fVar10 = *(float *)(bezier_basis0 + lVar17 + 0x1cfc);
    fVar11 = *(float *)(bezier_basis0 + lVar17 + 0x1d00);
    lVar17 = uVar20 * 4;
    fVar12 = *(float *)(bezier_basis0 + lVar17 + 0x2178);
    fVar13 = *(float *)(bezier_basis0 + lVar17 + 0x217c);
    fVar14 = *(float *)(bezier_basis0 + lVar17 + 0x2180);
    fVar138 = *(float *)(bezier_basis0 + lVar17 + 0x2184);
    fVar223 = fVar181 * fVar135 + fVar112 * fVar179 + fVar29 * fVar232 + fVar153 * fVar12;
    fVar229 = fVar181 * fVar154 + fVar112 * fVar189 + fVar29 * fVar243 + fVar153 * fVar13;
    fVar231 = fVar181 * fVar165 + fVar112 * fVar190 + fVar29 * fVar10 + fVar153 * fVar14;
    fVar233 = fVar181 * fVar178 + fVar112 * fVar192 + fVar29 * fVar11 + fVar153 * fVar138;
    fVar116 = fVar182 * fVar135 + fVar113 * fVar179 + fVar70 * fVar232 + fVar171 * fVar12;
    fVar125 = fVar182 * fVar154 + fVar113 * fVar189 + fVar70 * fVar243 + fVar171 * fVar13;
    fVar126 = fVar182 * fVar165 + fVar113 * fVar190 + fVar70 * fVar10 + fVar171 * fVar14;
    fVar127 = fVar182 * fVar178 + fVar113 * fVar192 + fVar70 * fVar11 + fVar171 * fVar138;
    fVar135 = fVar135 * fVar186 + fVar179 * fVar114 + fVar232 * fVar72 + fVar12 * fVar172;
    fVar154 = fVar154 * fVar186 + fVar189 * fVar114 + fVar243 * fVar72 + fVar13 * fVar172;
    fVar165 = fVar165 * fVar186 + fVar190 * fVar114 + fVar10 * fVar72 + fVar14 * fVar172;
    fVar178 = fVar178 * fVar186 + fVar192 * fVar114 + fVar11 * fVar72 + fVar138 * fVar172;
    uVar194 = -(uint)(uVar216 == 0);
    uVar200 = -(uint)(uVar216 == 1);
    uVar201 = -(uint)(uVar216 == 2);
    uVar202 = -(uint)(uVar216 == 3);
    uVar208 = -(uint)(uVar216 == 7);
    uVar214 = -(uint)(uVar216 == 6);
    uVar215 = -(uint)(uVar216 == 5);
    uVar216 = -(uint)(uVar216 == 4);
    auVar32._0_4_ = (float)(~uVar208 & (uint)fVar223) * 0.055555556 + auVar159._0_4_;
    auVar32._4_4_ = (float)(~uVar214 & (uint)fVar229) * 0.055555556 + auVar159._4_4_;
    auVar32._8_4_ = (float)(~uVar215 & (uint)fVar231) * 0.055555556 + auVar159._8_4_;
    auVar32._12_4_ = (float)(~uVar216 & (uint)fVar233) * 0.055555556 + auVar159._12_4_;
    auVar235 = minps(local_2b8,auVar159);
    auVar174 = maxps(local_288,auVar159);
    auVar224._0_8_ =
         CONCAT44(auVar159._4_4_ - (float)(~uVar200 & (uint)fVar229) * 0.055555556,
                  auVar159._0_4_ - (float)(~uVar194 & (uint)fVar223) * 0.055555556);
    auVar224._8_4_ = auVar159._8_4_ - (float)(~uVar201 & (uint)fVar231) * 0.055555556;
    auVar224._12_4_ = auVar159._12_4_ - (float)(~uVar202 & (uint)fVar233) * 0.055555556;
    auVar160._0_4_ = (float)(~uVar208 & (uint)fVar116) * 0.055555556 + auVar130._0_4_;
    auVar160._4_4_ = (float)(~uVar214 & (uint)fVar125) * 0.055555556 + auVar130._4_4_;
    auVar160._8_4_ = (float)(~uVar215 & (uint)fVar126) * 0.055555556 + auVar130._8_4_;
    auVar160._12_4_ = (float)(~uVar216 & (uint)fVar127) * 0.055555556 + auVar130._12_4_;
    auVar158 = minps(local_278,auVar130);
    auVar203 = maxps(_local_228,auVar130);
    auVar131._0_8_ =
         CONCAT44(auVar130._4_4_ - (float)(~uVar200 & (uint)fVar125) * 0.055555556,
                  auVar130._0_4_ - (float)(~uVar194 & (uint)fVar116) * 0.055555556);
    auVar131._8_4_ = auVar130._8_4_ - (float)(~uVar201 & (uint)fVar126) * 0.055555556;
    auVar131._12_4_ = auVar130._12_4_ - (float)(~uVar202 & (uint)fVar127) * 0.055555556;
    auVar209._0_4_ = (float)(~uVar208 & (uint)fVar135) * 0.055555556 + auVar139._0_4_;
    auVar209._4_4_ = (float)(~uVar214 & (uint)fVar154) * 0.055555556 + auVar139._4_4_;
    auVar209._8_4_ = (float)(~uVar215 & (uint)fVar165) * 0.055555556 + auVar139._8_4_;
    auVar209._12_4_ = (float)(~uVar216 & (uint)fVar178) * 0.055555556 + auVar139._12_4_;
    auVar217 = minps(local_268,auVar139);
    auVar188 = maxps(auVar120,auVar139);
    auVar140._0_8_ =
         CONCAT44(auVar139._4_4_ - (float)(~uVar200 & (uint)fVar154) * 0.055555556,
                  auVar139._0_4_ - (float)(~uVar194 & (uint)fVar135) * 0.055555556);
    auVar140._8_4_ = auVar139._8_4_ - (float)(~uVar201 & (uint)fVar165) * 0.055555556;
    auVar140._12_4_ = auVar139._12_4_ - (float)(~uVar202 & (uint)fVar178) * 0.055555556;
    auVar195._8_4_ = auVar224._8_4_;
    auVar195._0_8_ = auVar224._0_8_;
    auVar195._12_4_ = auVar224._12_4_;
    auVar196 = minps(auVar195,auVar32);
    auVar235 = minps(auVar235,auVar196);
    auVar197._8_4_ = auVar131._8_4_;
    auVar197._0_8_ = auVar131._0_8_;
    auVar197._12_4_ = auVar131._12_4_;
    auVar196 = minps(auVar197,auVar160);
    auVar158 = minps(auVar158,auVar196);
    auVar198._8_4_ = auVar140._8_4_;
    auVar198._0_8_ = auVar140._0_8_;
    auVar198._12_4_ = auVar140._12_4_;
    auVar196 = minps(auVar198,auVar209);
    auVar196 = minps(auVar217,auVar196);
    auVar33._0_4_ = ~uVar30 & auVar235._0_4_;
    auVar33._4_4_ = ~uVar71 & auVar235._4_4_;
    auVar33._8_4_ = ~uVar73 & auVar235._8_4_;
    auVar33._12_4_ = ~uVar75 & auVar235._12_4_;
    auVar236._0_4_ = local_2b8._0_4_ & uVar30;
    auVar236._4_4_ = local_2b8._4_4_ & uVar71;
    auVar236._8_4_ = local_2b8._8_4_ & uVar73;
    auVar236._12_4_ = local_2b8._12_4_ & uVar75;
    local_2b8 = auVar236 | auVar33;
    local_278._4_4_ = local_278._4_4_ & uVar71 | ~uVar71 & auVar158._4_4_;
    local_278._0_4_ = uVar187 & uVar30 | ~uVar30 & auVar158._0_4_;
    local_278._8_4_ = uVar191 & uVar73 | ~uVar73 & auVar158._8_4_;
    local_278._12_4_ = uVar193 & uVar75 | ~uVar75 & auVar158._12_4_;
    local_268._4_4_ = local_268._4_4_ & uVar71 | ~uVar71 & auVar196._4_4_;
    local_268._0_4_ = uVar22 & uVar30 | ~uVar30 & auVar196._0_4_;
    local_268._8_4_ = uVar183 & uVar73 | ~uVar73 & auVar196._8_4_;
    local_268._12_4_ = uVar185 & uVar75 | ~uVar75 & auVar196._12_4_;
    auVar158 = maxps(auVar224,auVar32);
    auVar158 = maxps(auVar174,auVar158);
    auVar174 = maxps(auVar131,auVar160);
    auVar196 = maxps(auVar203,auVar174);
    auVar174 = maxps(auVar140,auVar209);
    auVar188 = maxps(auVar188,auVar174);
    local_288._4_4_ = local_288._4_4_ & uVar71 | ~uVar71 & auVar158._4_4_;
    local_288._0_4_ = local_288._0_4_ & uVar30 | ~uVar30 & auVar158._0_4_;
    local_288._8_4_ = local_288._8_4_ & uVar73 | ~uVar73 & auVar158._8_4_;
    local_288._12_4_ = local_288._12_4_ & uVar75 | ~uVar75 & auVar158._12_4_;
    local_228._4_4_ = local_228._4_4_ & uVar71 | ~uVar71 & auVar196._4_4_;
    local_228._0_4_ = uVar207 & uVar30 | ~uVar30 & auVar196._0_4_;
    fStack_220 = (float)(uVar77 & uVar73 | ~uVar73 & auVar196._8_4_);
    fStack_21c = (float)(uVar95 & uVar75 | ~uVar75 & auVar196._12_4_);
    auVar119._0_4_ = auVar120._0_4_ & uVar30;
    auVar119._4_4_ = auVar120._4_4_ & uVar71;
    auVar119._8_4_ = auVar120._8_4_ & uVar73;
    auVar119._12_4_ = auVar120._12_4_ & uVar75;
    auVar120._0_4_ = ~uVar30 & auVar188._0_4_;
    auVar120._4_4_ = ~uVar71 & auVar188._4_4_;
    auVar120._8_4_ = ~uVar73 & auVar188._8_4_;
    auVar120._12_4_ = ~uVar75 & auVar188._12_4_;
    auVar120 = auVar119 | auVar120;
    uVar20 = uVar20 + 4;
  }
  fVar234 = fVar234 + fVar128;
  fVar241 = fVar241 + fVar136;
  fVar242 = fVar242 + fVar155;
  fVar115 = fVar115 + fVar94;
  fVar124 = fVar124 + fVar96;
  fVar230 = fVar230 + fVar97;
  fVar29 = (fVar180 + fVar76) * 0.33333334 + fVar234;
  fVar70 = (fVar184 + fVar170) * 0.33333334 + fVar241;
  fVar72 = (fVar151 + fVar177) * 0.33333334 + fVar242;
  fVar76 = fVar115 - (fVar98 + fVar137) * 0.33333334;
  fVar74 = fVar124 - (fVar74 + fVar150) * 0.33333334;
  fVar94 = fVar230 - (fVar156 + fVar152) * 0.33333334;
  auVar34._4_4_ = local_2b8._0_4_;
  auVar34._0_4_ = local_2b8._4_4_;
  auVar34._8_4_ = local_2b8._12_4_;
  auVar34._12_4_ = local_2b8._8_4_;
  auVar158 = minps(auVar34,local_2b8);
  auVar78._0_8_ = auVar158._8_8_;
  auVar78._8_4_ = auVar158._0_4_;
  auVar78._12_4_ = auVar158._4_4_;
  auVar188 = minps(auVar78,auVar158);
  auVar35._4_4_ = uVar187;
  auVar35._0_4_ = local_278._4_4_;
  auVar35._8_4_ = uVar193;
  auVar35._12_4_ = uVar191;
  auVar158 = minps(auVar35,local_278);
  auVar141._0_8_ = auVar158._8_8_;
  auVar141._8_4_ = auVar158._0_4_;
  auVar141._12_4_ = auVar158._4_4_;
  auVar174 = minps(auVar141,auVar158);
  auVar36._4_4_ = uVar22;
  auVar36._0_4_ = local_268._4_4_;
  auVar36._8_4_ = uVar185;
  auVar36._12_4_ = uVar183;
  auVar158 = minps(auVar36,local_268);
  auVar37._0_8_ = auVar158._8_8_;
  auVar37._8_4_ = auVar158._0_4_;
  auVar37._12_4_ = auVar158._4_4_;
  auVar121._4_4_ = auVar174._0_4_;
  auVar121._0_4_ = auVar188._0_4_;
  auVar38._4_4_ = local_288._0_4_;
  auVar38._0_4_ = local_288._4_4_;
  auVar38._8_4_ = local_288._12_4_;
  auVar38._12_4_ = local_288._8_4_;
  auVar188 = maxps(auVar38,local_288);
  auVar79._0_8_ = auVar188._8_8_;
  auVar79._8_4_ = auVar188._0_4_;
  auVar79._12_4_ = auVar188._4_4_;
  auVar174 = maxps(auVar79,auVar188);
  auVar39._4_4_ = uVar207;
  auVar39._0_4_ = local_228._4_4_;
  auVar39._8_4_ = uVar95;
  auVar39._12_4_ = uVar77;
  auVar188 = maxps(auVar39,_local_228);
  auVar142._0_8_ = auVar188._8_8_;
  auVar142._8_4_ = auVar188._0_4_;
  auVar142._12_4_ = auVar188._4_4_;
  auVar196 = maxps(auVar142,auVar188);
  auVar40._4_4_ = auVar120._0_4_;
  auVar40._0_4_ = auVar120._4_4_;
  auVar40._8_4_ = auVar120._12_4_;
  auVar40._12_4_ = auVar120._8_4_;
  auVar188 = maxps(auVar40,auVar120);
  auVar41._0_8_ = auVar188._8_8_;
  auVar41._8_4_ = auVar188._0_4_;
  auVar41._12_4_ = auVar188._4_4_;
  auVar132._4_4_ = auVar196._0_4_;
  auVar132._0_4_ = auVar174._0_4_;
  uVar20 = 0;
  local_278 = _DAT_01f45a40;
  local_268 = _DAT_01f45a40;
  local_2b8._8_8_ = 0x7f8000007f800000;
  local_2b8._0_8_ = 0x7f8000007f800000;
  local_258._8_8_ = 0x7f8000007f800000;
  local_258._0_8_ = 0x7f8000007f800000;
  local_248._8_8_ = 0x7f8000007f800000;
  local_248._0_8_ = 0x7f8000007f800000;
  auVar176 = _DAT_01f45a40;
  while( true ) {
    uVar22 = local_268._0_4_;
    uVar183 = local_268._8_4_;
    uVar185 = local_268._12_4_;
    uVar187 = local_248._0_4_;
    uVar191 = local_248._8_4_;
    uVar193 = local_248._12_4_;
    if (7 < uVar20) break;
    uVar207 = (uint)uVar20;
    uVar77 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
    uVar95 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
    uVar216 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
    uVar30 = -(uint)(-0x7ffffff9 < (int)(uVar207 ^ 0x80000000));
    lVar17 = uVar20 * 4;
    fVar96 = *(float *)(bezier_basis0 + lVar17 + 0x1dc);
    fVar97 = *(float *)(bezier_basis0 + lVar17 + 0x1e0);
    fVar137 = *(float *)(bezier_basis0 + lVar17 + 0x1e4);
    fVar150 = *(float *)(bezier_basis0 + lVar17 + 0x1e8);
    lVar17 = uVar20 * 4;
    fVar152 = *(float *)(bezier_basis0 + lVar17 + 0x660);
    fVar156 = *(float *)(bezier_basis0 + lVar17 + 0x664);
    fVar98 = *(float *)(bezier_basis0 + lVar17 + 0x668);
    fVar112 = *(float *)(bezier_basis0 + lVar17 + 0x66c);
    lVar17 = uVar20 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar17 + 0xae4);
    fVar114 = *(float *)(bezier_basis0 + lVar17 + 0xae8);
    fVar128 = *(float *)(bezier_basis0 + lVar17 + 0xaec);
    fVar135 = *(float *)(bezier_basis0 + lVar17 + 0xaf0);
    lVar17 = uVar20 * 4;
    fVar136 = *(float *)(bezier_basis0 + lVar17 + 0xf68);
    fVar154 = *(float *)(bezier_basis0 + lVar17 + 0xf6c);
    fVar155 = *(float *)(bezier_basis0 + lVar17 + 0xf70);
    fVar165 = *(float *)(bezier_basis0 + lVar17 + 0xf74);
    auVar161._0_4_ = fVar234 * fVar96 + fVar29 * fVar152 + fVar76 * fVar113 + fVar115 * fVar136;
    auVar161._4_4_ = fVar234 * fVar97 + fVar29 * fVar156 + fVar76 * fVar114 + fVar115 * fVar154;
    auVar161._8_4_ = fVar234 * fVar137 + fVar29 * fVar98 + fVar76 * fVar128 + fVar115 * fVar155;
    auVar161._12_4_ = fVar234 * fVar150 + fVar29 * fVar112 + fVar76 * fVar135 + fVar115 * fVar165;
    auVar218._0_4_ = fVar241 * fVar96 + fVar70 * fVar152 + fVar74 * fVar113 + fVar124 * fVar136;
    auVar218._4_4_ = fVar241 * fVar97 + fVar70 * fVar156 + fVar74 * fVar114 + fVar124 * fVar154;
    auVar218._8_4_ = fVar241 * fVar137 + fVar70 * fVar98 + fVar74 * fVar128 + fVar124 * fVar155;
    auVar218._12_4_ = fVar241 * fVar150 + fVar70 * fVar112 + fVar74 * fVar135 + fVar124 * fVar165;
    auVar237._0_4_ = fVar96 * fVar242 + fVar152 * fVar72 + fVar113 * fVar94 + fVar136 * fVar230;
    auVar237._4_4_ = fVar97 * fVar242 + fVar156 * fVar72 + fVar114 * fVar94 + fVar154 * fVar230;
    auVar237._8_4_ = fVar137 * fVar242 + fVar98 * fVar72 + fVar128 * fVar94 + fVar155 * fVar230;
    auVar237._12_4_ = fVar150 * fVar242 + fVar112 * fVar72 + fVar135 * fVar94 + fVar165 * fVar230;
    lVar17 = uVar20 * 4;
    fVar96 = *(float *)(bezier_basis0 + lVar17 + 0x13ec);
    fVar97 = *(float *)(bezier_basis0 + lVar17 + 0x13f0);
    fVar137 = *(float *)(bezier_basis0 + lVar17 + 0x13f4);
    fVar150 = *(float *)(bezier_basis0 + lVar17 + 0x13f8);
    lVar17 = uVar20 * 4;
    fVar152 = *(float *)(bezier_basis0 + lVar17 + 0x1870);
    fVar156 = *(float *)(bezier_basis0 + lVar17 + 0x1874);
    fVar98 = *(float *)(bezier_basis0 + lVar17 + 0x1878);
    fVar112 = *(float *)(bezier_basis0 + lVar17 + 0x187c);
    lVar17 = uVar20 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar17 + 0x1cf4);
    fVar114 = *(float *)(bezier_basis0 + lVar17 + 0x1cf8);
    fVar128 = *(float *)(bezier_basis0 + lVar17 + 0x1cfc);
    fVar135 = *(float *)(bezier_basis0 + lVar17 + 0x1d00);
    lVar17 = uVar20 * 4;
    fVar136 = *(float *)(bezier_basis0 + lVar17 + 0x2178);
    fVar154 = *(float *)(bezier_basis0 + lVar17 + 0x217c);
    fVar155 = *(float *)(bezier_basis0 + lVar17 + 0x2180);
    fVar165 = *(float *)(bezier_basis0 + lVar17 + 0x2184);
    fVar170 = fVar234 * fVar96 + fVar29 * fVar152 + fVar76 * fVar113 + fVar115 * fVar136;
    fVar177 = fVar234 * fVar97 + fVar29 * fVar156 + fVar76 * fVar114 + fVar115 * fVar154;
    fVar180 = fVar234 * fVar137 + fVar29 * fVar98 + fVar76 * fVar128 + fVar115 * fVar155;
    fVar184 = fVar234 * fVar150 + fVar29 * fVar112 + fVar76 * fVar135 + fVar115 * fVar165;
    fVar151 = fVar241 * fVar96 + fVar70 * fVar152 + fVar74 * fVar113 + fVar124 * fVar136;
    fVar153 = fVar241 * fVar97 + fVar70 * fVar156 + fVar74 * fVar114 + fVar124 * fVar154;
    fVar171 = fVar241 * fVar137 + fVar70 * fVar98 + fVar74 * fVar128 + fVar124 * fVar155;
    fVar172 = fVar241 * fVar150 + fVar70 * fVar112 + fVar74 * fVar135 + fVar124 * fVar165;
    fVar96 = fVar96 * fVar242 + fVar152 * fVar72 + fVar113 * fVar94 + fVar136 * fVar230;
    fVar97 = fVar97 * fVar242 + fVar156 * fVar72 + fVar114 * fVar94 + fVar154 * fVar230;
    fVar137 = fVar137 * fVar242 + fVar98 * fVar72 + fVar128 * fVar94 + fVar155 * fVar230;
    fVar150 = fVar150 * fVar242 + fVar112 * fVar72 + fVar135 * fVar94 + fVar165 * fVar230;
    uVar71 = -(uint)(uVar207 == 0);
    uVar73 = -(uint)(uVar207 == 1);
    uVar75 = -(uint)(uVar207 == 2);
    uVar194 = -(uint)(uVar207 == 3);
    uVar200 = -(uint)(uVar207 == 7);
    uVar201 = -(uint)(uVar207 == 6);
    uVar202 = -(uint)(uVar207 == 5);
    uVar207 = -(uint)(uVar207 == 4);
    local_228._4_4_ = (float)(~uVar201 & (uint)fVar177) * 0.055555556 + auVar161._4_4_;
    local_228._0_4_ = (float)(~uVar200 & (uint)fVar170) * 0.055555556 + auVar161._0_4_;
    fStack_220 = (float)(~uVar202 & (uint)fVar180) * 0.055555556 + auVar161._8_4_;
    fStack_21c = (float)(~uVar207 & (uint)fVar184) * 0.055555556 + auVar161._12_4_;
    auVar174 = minps(local_2b8,auVar161);
    auVar196 = maxps(local_278,auVar161);
    auVar162._0_8_ =
         CONCAT44(auVar161._4_4_ - (float)(~uVar73 & (uint)fVar177) * 0.055555556,
                  auVar161._0_4_ - (float)(~uVar71 & (uint)fVar170) * 0.055555556);
    auVar162._8_4_ = auVar161._8_4_ - (float)(~uVar75 & (uint)fVar180) * 0.055555556;
    auVar162._12_4_ = auVar161._12_4_ - (float)(~uVar194 & (uint)fVar184) * 0.055555556;
    auVar80._0_4_ = (float)(~uVar200 & (uint)fVar151) * 0.055555556 + auVar218._0_4_;
    auVar80._4_4_ = (float)(~uVar201 & (uint)fVar153) * 0.055555556 + auVar218._4_4_;
    auVar80._8_4_ = (float)(~uVar202 & (uint)fVar171) * 0.055555556 + auVar218._8_4_;
    auVar80._12_4_ = (float)(~uVar207 & (uint)fVar172) * 0.055555556 + auVar218._12_4_;
    auVar203 = minps(local_258,auVar218);
    auVar167 = maxps(local_268,auVar218);
    auVar219._0_8_ =
         CONCAT44(auVar218._4_4_ - (float)(~uVar73 & (uint)fVar153) * 0.055555556,
                  auVar218._0_4_ - (float)(~uVar71 & (uint)fVar151) * 0.055555556);
    auVar219._8_4_ = auVar218._8_4_ - (float)(~uVar75 & (uint)fVar171) * 0.055555556;
    auVar219._12_4_ = auVar218._12_4_ - (float)(~uVar194 & (uint)fVar172) * 0.055555556;
    auVar42._0_4_ = (float)(~uVar200 & (uint)fVar96) * 0.055555556 + auVar237._0_4_;
    auVar42._4_4_ = (float)(~uVar201 & (uint)fVar97) * 0.055555556 + auVar237._4_4_;
    auVar42._8_4_ = (float)(~uVar202 & (uint)fVar137) * 0.055555556 + auVar237._8_4_;
    auVar42._12_4_ = (float)(~uVar207 & (uint)fVar150) * 0.055555556 + auVar237._12_4_;
    auVar199 = minps(local_248,auVar237);
    auVar217 = maxps(auVar176,auVar237);
    auVar238._0_8_ =
         CONCAT44(auVar237._4_4_ - (float)(~uVar73 & (uint)fVar97) * 0.055555556,
                  auVar237._0_4_ - (float)(~uVar71 & (uint)fVar96) * 0.055555556);
    auVar238._8_4_ = auVar237._8_4_ - (float)(~uVar75 & (uint)fVar137) * 0.055555556;
    auVar238._12_4_ = auVar237._12_4_ - (float)(~uVar194 & (uint)fVar150) * 0.055555556;
    auVar143._8_4_ = auVar162._8_4_;
    auVar143._0_8_ = auVar162._0_8_;
    auVar143._12_4_ = auVar162._12_4_;
    auVar235 = minps(auVar143,_local_228);
    auVar235 = minps(auVar174,auVar235);
    auVar144._8_4_ = auVar219._8_4_;
    auVar144._0_8_ = auVar219._0_8_;
    auVar144._12_4_ = auVar219._12_4_;
    auVar174 = minps(auVar144,auVar80);
    auVar174 = minps(auVar203,auVar174);
    auVar145._8_4_ = auVar238._8_4_;
    auVar145._0_8_ = auVar238._0_8_;
    auVar145._12_4_ = auVar238._12_4_;
    auVar203 = minps(auVar145,auVar42);
    auVar203 = minps(auVar199,auVar203);
    auVar43._0_4_ = ~uVar77 & auVar235._0_4_;
    auVar43._4_4_ = ~uVar95 & auVar235._4_4_;
    auVar43._8_4_ = ~uVar216 & auVar235._8_4_;
    auVar43._12_4_ = ~uVar30 & auVar235._12_4_;
    auVar204._0_4_ = local_2b8._0_4_ & uVar77;
    auVar204._4_4_ = local_2b8._4_4_ & uVar95;
    auVar204._8_4_ = local_2b8._8_4_ & uVar216;
    auVar204._12_4_ = local_2b8._12_4_ & uVar30;
    local_2b8 = auVar204 | auVar43;
    auVar44._0_4_ = ~uVar77 & auVar174._0_4_;
    auVar44._4_4_ = ~uVar95 & auVar174._4_4_;
    auVar44._8_4_ = ~uVar216 & auVar174._8_4_;
    auVar44._12_4_ = ~uVar30 & auVar174._12_4_;
    auVar210._0_4_ = local_258._0_4_ & uVar77;
    auVar210._4_4_ = local_258._4_4_ & uVar95;
    auVar210._8_4_ = local_258._8_4_ & uVar216;
    auVar210._12_4_ = local_258._12_4_ & uVar30;
    local_258 = auVar210 | auVar44;
    local_248._4_4_ = local_248._4_4_ & uVar95 | ~uVar95 & auVar203._4_4_;
    local_248._0_4_ = uVar187 & uVar77 | ~uVar77 & auVar203._0_4_;
    local_248._8_4_ = uVar191 & uVar216 | ~uVar216 & auVar203._8_4_;
    local_248._12_4_ = uVar193 & uVar30 | ~uVar30 & auVar203._12_4_;
    auVar174 = maxps(auVar162,_local_228);
    auVar174 = maxps(auVar196,auVar174);
    auVar196 = maxps(auVar219,auVar80);
    auVar203 = maxps(auVar167,auVar196);
    auVar196 = maxps(auVar238,auVar42);
    auVar196 = maxps(auVar217,auVar196);
    auVar45._0_4_ = ~uVar77 & auVar174._0_4_;
    auVar45._4_4_ = ~uVar95 & auVar174._4_4_;
    auVar45._8_4_ = ~uVar216 & auVar174._8_4_;
    auVar45._12_4_ = ~uVar30 & auVar174._12_4_;
    auVar225._0_4_ = local_278._0_4_ & uVar77;
    auVar225._4_4_ = local_278._4_4_ & uVar95;
    auVar225._8_4_ = local_278._8_4_ & uVar216;
    auVar225._12_4_ = local_278._12_4_ & uVar30;
    local_278 = auVar225 | auVar45;
    local_268._4_4_ = local_268._4_4_ & uVar95 | ~uVar95 & auVar203._4_4_;
    local_268._0_4_ = uVar22 & uVar77 | ~uVar77 & auVar203._0_4_;
    local_268._8_4_ = uVar183 & uVar216 | ~uVar216 & auVar203._8_4_;
    local_268._12_4_ = uVar185 & uVar30 | ~uVar30 & auVar203._12_4_;
    auVar175._0_4_ = auVar176._0_4_ & uVar77;
    auVar175._4_4_ = auVar176._4_4_ & uVar95;
    auVar175._8_4_ = auVar176._8_4_ & uVar216;
    auVar175._12_4_ = auVar176._12_4_ & uVar30;
    auVar176._0_4_ = ~uVar77 & auVar196._0_4_;
    auVar176._4_4_ = ~uVar95 & auVar196._4_4_;
    auVar176._8_4_ = ~uVar216 & auVar196._8_4_;
    auVar176._12_4_ = ~uVar30 & auVar196._12_4_;
    auVar176 = auVar175 | auVar176;
    uVar20 = uVar20 + 4;
  }
  auVar158 = minps(auVar37,auVar158);
  auVar121._8_4_ = auVar158._0_4_;
  auVar121._12_4_ = 0;
  auVar158 = maxps(auVar41,auVar188);
  auVar132._8_4_ = auVar158._0_4_;
  auVar132._12_4_ = 0;
  auVar46._4_4_ = local_2b8._0_4_;
  auVar46._0_4_ = local_2b8._4_4_;
  auVar46._8_4_ = local_2b8._12_4_;
  auVar46._12_4_ = local_2b8._8_4_;
  auVar158 = minps(auVar46,local_2b8);
  auVar81._0_8_ = auVar158._8_8_;
  auVar81._8_4_ = auVar158._0_4_;
  auVar81._12_4_ = auVar158._4_4_;
  auVar188 = minps(auVar81,auVar158);
  auVar47._4_4_ = local_258._0_4_;
  auVar47._0_4_ = local_258._4_4_;
  auVar47._8_4_ = local_258._12_4_;
  auVar47._12_4_ = local_258._8_4_;
  auVar158 = minps(auVar47,local_258);
  auVar100._0_8_ = auVar158._8_8_;
  auVar100._8_4_ = auVar158._0_4_;
  auVar100._12_4_ = auVar158._4_4_;
  auVar174 = minps(auVar100,auVar158);
  auVar48._4_4_ = uVar187;
  auVar48._0_4_ = local_248._4_4_;
  auVar48._8_4_ = uVar193;
  auVar48._12_4_ = uVar191;
  auVar158 = minps(auVar48,local_248);
  auVar82._0_8_ = auVar158._8_8_;
  auVar82._8_4_ = auVar158._0_4_;
  auVar82._12_4_ = auVar158._4_4_;
  auVar158 = minps(auVar82,auVar158);
  auVar101._4_4_ = auVar174._0_4_;
  auVar101._0_4_ = auVar188._0_4_;
  auVar101._8_4_ = auVar158._0_4_;
  auVar101._12_4_ = 0;
  auVar196 = minps(auVar121,auVar101);
  auVar49._4_4_ = local_278._0_4_;
  auVar49._0_4_ = local_278._4_4_;
  auVar49._8_4_ = local_278._12_4_;
  auVar49._12_4_ = local_278._8_4_;
  auVar158 = maxps(auVar49,local_278);
  auVar83._0_8_ = auVar158._8_8_;
  auVar83._8_4_ = auVar158._0_4_;
  auVar83._12_4_ = auVar158._4_4_;
  auVar188 = maxps(auVar83,auVar158);
  auVar50._4_4_ = uVar22;
  auVar50._0_4_ = local_268._4_4_;
  auVar50._8_4_ = uVar185;
  auVar50._12_4_ = uVar183;
  auVar158 = maxps(auVar50,local_268);
  auVar102._0_8_ = auVar158._8_8_;
  auVar102._8_4_ = auVar158._0_4_;
  auVar102._12_4_ = auVar158._4_4_;
  auVar174 = maxps(auVar102,auVar158);
  auVar51._4_4_ = auVar176._0_4_;
  auVar51._0_4_ = auVar176._4_4_;
  auVar51._8_4_ = auVar176._12_4_;
  auVar51._12_4_ = auVar176._8_4_;
  auVar158 = maxps(auVar51,auVar176);
  auVar84._0_8_ = auVar158._8_8_;
  auVar84._8_4_ = auVar158._0_4_;
  auVar84._12_4_ = auVar158._4_4_;
  auVar158 = maxps(auVar84,auVar158);
  auVar103._4_4_ = auVar174._0_4_;
  auVar103._0_4_ = auVar188._0_4_;
  auVar103._8_4_ = auVar158._0_4_;
  auVar103._12_4_ = 0;
  auVar158 = maxps(auVar132,auVar103);
  auVar133._0_4_ = -(uint)(auVar158._0_4_ < 1.844e+18 && -1.844e+18 < auVar196._0_4_);
  auVar133._4_4_ = -(uint)(auVar158._4_4_ < 1.844e+18 && -1.844e+18 < auVar196._4_4_);
  auVar133._8_4_ = -(uint)(auVar158._8_4_ < 1.844e+18 && -1.844e+18 < auVar196._8_4_);
  auVar133._12_4_ = -(uint)(auVar158._12_4_ < 1.844e+18 && -1.844e+18 < auVar196._12_4_);
  uVar18 = movmskps((int)pcVar8,auVar133);
  lVar24 = lVar24 + 1;
  if ((~(byte)uVar18 & 7) != 0) goto LAB_001fcab2;
  goto LAB_001fbb2c;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }